

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  float fVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [12];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar57;
  int iVar58;
  int iVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  byte bVar63;
  byte bVar64;
  byte bVar65;
  long lVar66;
  byte bVar67;
  ulong uVar68;
  ulong uVar69;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined8 in_R10;
  bool bVar70;
  uint uVar71;
  uint uVar133;
  uint uVar134;
  uint uVar136;
  uint uVar137;
  uint uVar138;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  uint uVar135;
  uint uVar139;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float pp;
  float fVar140;
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar173 [16];
  undefined1 auVar177 [32];
  float fVar178;
  float fVar179;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar208 [32];
  undefined1 auVar212 [16];
  float fVar218;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar219 [16];
  float fVar223;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  float fVar229;
  undefined1 auVar230 [32];
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar231 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  float fVar237;
  undefined1 auVar238 [28];
  float fVar239;
  undefined1 auVar240 [64];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_a44;
  undefined1 local_860 [16];
  uint local_850;
  uint local_84c;
  float local_848;
  float local_844;
  undefined1 local_840 [32];
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  Primitive *local_750;
  ulong local_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 auStack_590 [16];
  undefined1 local_580 [32];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  RTCHitN local_520 [16];
  undefined1 auStack_510 [16];
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  float local_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [16];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  uint local_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint uStack_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar241 [16];
  
  uVar69 = (ulong)(byte)prim[1];
  fVar229 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar81 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar80 = vsubps_avx(auVar74,*(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  fVar201 = fVar229 * auVar80._0_4_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar69 * 4 + 6);
  auVar87 = vpmovsxbd_avx2(auVar74);
  fVar140 = fVar229 * auVar81._0_4_;
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar69 * 5 + 6);
  auVar85 = vpmovsxbd_avx2(auVar75);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar69 * 6 + 6);
  auVar88 = vpmovsxbd_avx2(auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar89 = vpmovsxbd_avx2(auVar77);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar69 * 0xc + 6);
  auVar90 = vpmovsxbd_avx2(auVar72);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar86 = vpmovsxbd_avx2(auVar1);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar91 = vpmovsxbd_avx2(auVar78);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar69 * 0x13 + 6);
  auVar92 = vpmovsxbd_avx2(auVar73);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar69 * 0x14 + 6);
  auVar94 = vpmovsxbd_avx2(auVar79);
  auVar93 = vcvtdq2ps_avx(auVar94);
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  auVar103._4_4_ = fVar140;
  auVar103._0_4_ = fVar140;
  auVar103._8_4_ = fVar140;
  auVar103._12_4_ = fVar140;
  auVar103._16_4_ = fVar140;
  auVar103._20_4_ = fVar140;
  auVar103._24_4_ = fVar140;
  auVar103._28_4_ = fVar140;
  auVar84 = ZEXT1632(CONCAT412(fVar229 * auVar81._12_4_,
                               CONCAT48(fVar229 * auVar81._8_4_,
                                        CONCAT44(fVar229 * auVar81._4_4_,fVar140))));
  auVar95 = vpermps_avx2(auVar105,auVar84);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar83 = vpermps_avx512vl(auVar82,auVar84);
  fVar140 = auVar83._0_4_;
  auVar222._0_4_ = fVar140 * auVar88._0_4_;
  fVar232 = auVar83._4_4_;
  auVar222._4_4_ = fVar232 * auVar88._4_4_;
  fVar233 = auVar83._8_4_;
  auVar222._8_4_ = fVar233 * auVar88._8_4_;
  fVar234 = auVar83._12_4_;
  auVar222._12_4_ = fVar234 * auVar88._12_4_;
  fVar209 = auVar83._16_4_;
  auVar222._16_4_ = fVar209 * auVar88._16_4_;
  fVar210 = auVar83._20_4_;
  auVar222._20_4_ = fVar210 * auVar88._20_4_;
  fVar211 = auVar83._24_4_;
  auVar222._28_36_ = in_ZMM4._28_36_;
  auVar222._24_4_ = fVar211 * auVar88._24_4_;
  auVar84._4_4_ = auVar86._4_4_ * fVar232;
  auVar84._0_4_ = auVar86._0_4_ * fVar140;
  auVar84._8_4_ = auVar86._8_4_ * fVar233;
  auVar84._12_4_ = auVar86._12_4_ * fVar234;
  auVar84._16_4_ = auVar86._16_4_ * fVar209;
  auVar84._20_4_ = auVar86._20_4_ * fVar210;
  auVar84._24_4_ = auVar86._24_4_ * fVar211;
  auVar84._28_4_ = auVar94._28_4_;
  auVar94._4_4_ = fVar232 * auVar93._4_4_;
  auVar94._0_4_ = fVar140 * auVar93._0_4_;
  auVar94._8_4_ = fVar233 * auVar93._8_4_;
  auVar94._12_4_ = fVar234 * auVar93._12_4_;
  auVar94._16_4_ = fVar209 * auVar93._16_4_;
  auVar94._20_4_ = fVar210 * auVar93._20_4_;
  auVar94._24_4_ = fVar211 * auVar93._24_4_;
  auVar94._28_4_ = auVar83._28_4_;
  auVar74 = vfmadd231ps_fma(auVar222._0_32_,auVar95,auVar85);
  auVar75 = vfmadd231ps_fma(auVar84,auVar95,auVar90);
  auVar76 = vfmadd231ps_fma(auVar94,auVar92,auVar95);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar103,auVar87);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar103,auVar89);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar91,auVar103);
  auVar104._4_4_ = fVar201;
  auVar104._0_4_ = fVar201;
  auVar104._8_4_ = fVar201;
  auVar104._12_4_ = fVar201;
  auVar104._16_4_ = fVar201;
  auVar104._20_4_ = fVar201;
  auVar104._24_4_ = fVar201;
  auVar104._28_4_ = fVar201;
  auVar95 = ZEXT1632(CONCAT412(fVar229 * auVar80._12_4_,
                               CONCAT48(fVar229 * auVar80._8_4_,
                                        CONCAT44(fVar229 * auVar80._4_4_,fVar201))));
  auVar94 = vpermps_avx2(auVar105,auVar95);
  auVar84 = vpermps_avx512vl(auVar82,auVar95);
  fVar229 = auVar84._0_4_;
  fVar140 = auVar84._4_4_;
  auVar95._4_4_ = fVar140 * auVar88._4_4_;
  auVar95._0_4_ = fVar229 * auVar88._0_4_;
  fVar232 = auVar84._8_4_;
  auVar95._8_4_ = fVar232 * auVar88._8_4_;
  fVar233 = auVar84._12_4_;
  auVar95._12_4_ = fVar233 * auVar88._12_4_;
  fVar234 = auVar84._16_4_;
  auVar95._16_4_ = fVar234 * auVar88._16_4_;
  fVar209 = auVar84._20_4_;
  auVar95._20_4_ = fVar209 * auVar88._20_4_;
  fVar210 = auVar84._24_4_;
  auVar95._24_4_ = fVar210 * auVar88._24_4_;
  auVar95._28_4_ = auVar88._28_4_;
  auVar98._0_4_ = fVar229 * auVar86._0_4_;
  auVar98._4_4_ = fVar140 * auVar86._4_4_;
  auVar98._8_4_ = fVar232 * auVar86._8_4_;
  auVar98._12_4_ = fVar233 * auVar86._12_4_;
  auVar98._16_4_ = fVar234 * auVar86._16_4_;
  auVar98._20_4_ = fVar209 * auVar86._20_4_;
  auVar98._24_4_ = fVar210 * auVar86._24_4_;
  auVar98._28_4_ = 0;
  auVar86._4_4_ = fVar140 * auVar93._4_4_;
  auVar86._0_4_ = fVar229 * auVar93._0_4_;
  auVar86._8_4_ = fVar232 * auVar93._8_4_;
  auVar86._12_4_ = fVar233 * auVar93._12_4_;
  auVar86._16_4_ = fVar234 * auVar93._16_4_;
  auVar86._20_4_ = fVar209 * auVar93._20_4_;
  auVar86._24_4_ = fVar210 * auVar93._24_4_;
  auVar86._28_4_ = auVar93._28_4_;
  auVar77 = vfmadd231ps_fma(auVar95,auVar94,auVar85);
  auVar72 = vfmadd231ps_fma(auVar98,auVar94,auVar90);
  auVar1 = vfmadd231ps_fma(auVar86,auVar94,auVar92);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar104,auVar87);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar104,auVar89);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar104,auVar91);
  auVar100._8_4_ = 0x7fffffff;
  auVar100._0_8_ = 0x7fffffff7fffffff;
  auVar100._12_4_ = 0x7fffffff;
  auVar100._16_4_ = 0x7fffffff;
  auVar100._20_4_ = 0x7fffffff;
  auVar100._24_4_ = 0x7fffffff;
  auVar100._28_4_ = 0x7fffffff;
  auVar102._8_4_ = 0x219392ef;
  auVar102._0_8_ = 0x219392ef219392ef;
  auVar102._12_4_ = 0x219392ef;
  auVar102._16_4_ = 0x219392ef;
  auVar102._20_4_ = 0x219392ef;
  auVar102._24_4_ = 0x219392ef;
  auVar102._28_4_ = 0x219392ef;
  auVar87 = vandps_avx(ZEXT1632(auVar74),auVar100);
  uVar68 = vcmpps_avx512vl(auVar87,auVar102,1);
  bVar70 = (bool)((byte)uVar68 & 1);
  auVar82._0_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar74._0_4_;
  bVar70 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar74._4_4_;
  bVar70 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar74._8_4_;
  bVar70 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar74._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar87 = vandps_avx(ZEXT1632(auVar75),auVar100);
  uVar68 = vcmpps_avx512vl(auVar87,auVar102,1);
  bVar70 = (bool)((byte)uVar68 & 1);
  auVar83._0_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar75._0_4_;
  bVar70 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar75._4_4_;
  bVar70 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar75._8_4_;
  bVar70 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar75._12_4_;
  auVar83._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar83._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar83._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar83._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar87 = vandps_avx(ZEXT1632(auVar76),auVar100);
  uVar68 = vcmpps_avx512vl(auVar87,auVar102,1);
  bVar70 = (bool)((byte)uVar68 & 1);
  auVar87._0_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar76._0_4_;
  bVar70 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar76._4_4_;
  bVar70 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar76._8_4_;
  bVar70 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar76._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar85 = vrcp14ps_avx512vl(auVar82);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = 0x3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar101._16_4_ = 0x3f800000;
  auVar101._20_4_ = 0x3f800000;
  auVar101._24_4_ = 0x3f800000;
  auVar101._28_4_ = 0x3f800000;
  auVar74 = vfnmadd213ps_fma(auVar82,auVar85,auVar101);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar83);
  auVar75 = vfnmadd213ps_fma(auVar83,auVar85,auVar101);
  auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar87);
  auVar76 = vfnmadd213ps_fma(auVar87,auVar85,auVar101);
  auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar85,auVar85);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 7 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar77));
  auVar91._4_4_ = auVar74._4_4_ * auVar87._4_4_;
  auVar91._0_4_ = auVar74._0_4_ * auVar87._0_4_;
  auVar91._8_4_ = auVar74._8_4_ * auVar87._8_4_;
  auVar91._12_4_ = auVar74._12_4_ * auVar87._12_4_;
  auVar91._16_4_ = auVar87._16_4_ * 0.0;
  auVar91._20_4_ = auVar87._20_4_ * 0.0;
  auVar91._24_4_ = auVar87._24_4_ * 0.0;
  auVar91._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 9 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar77));
  auVar99._0_4_ = auVar74._0_4_ * auVar87._0_4_;
  auVar99._4_4_ = auVar74._4_4_ * auVar87._4_4_;
  auVar99._8_4_ = auVar74._8_4_ * auVar87._8_4_;
  auVar99._12_4_ = auVar74._12_4_ * auVar87._12_4_;
  auVar99._16_4_ = auVar87._16_4_ * 0.0;
  auVar99._20_4_ = auVar87._20_4_ * 0.0;
  auVar99._24_4_ = auVar87._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0xe + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar72));
  auVar92._4_4_ = auVar75._4_4_ * auVar87._4_4_;
  auVar92._0_4_ = auVar75._0_4_ * auVar87._0_4_;
  auVar92._8_4_ = auVar75._8_4_ * auVar87._8_4_;
  auVar92._12_4_ = auVar75._12_4_ * auVar87._12_4_;
  auVar92._16_4_ = auVar87._16_4_ * 0.0;
  auVar92._20_4_ = auVar87._20_4_ * 0.0;
  auVar92._24_4_ = auVar87._24_4_ * 0.0;
  auVar92._28_4_ = auVar87._28_4_;
  auVar86 = vpbroadcastd_avx512vl();
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar72));
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x15 + 6));
  auVar97._0_4_ = auVar75._0_4_ * auVar87._0_4_;
  auVar97._4_4_ = auVar75._4_4_ * auVar87._4_4_;
  auVar97._8_4_ = auVar75._8_4_ * auVar87._8_4_;
  auVar97._12_4_ = auVar75._12_4_ * auVar87._12_4_;
  auVar97._16_4_ = auVar87._16_4_ * 0.0;
  auVar97._20_4_ = auVar87._20_4_ * 0.0;
  auVar97._24_4_ = auVar87._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar87 = vcvtdq2ps_avx(auVar85);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar1));
  auVar93._4_4_ = auVar87._4_4_ * auVar76._4_4_;
  auVar93._0_4_ = auVar87._0_4_ * auVar76._0_4_;
  auVar93._8_4_ = auVar87._8_4_ * auVar76._8_4_;
  auVar93._12_4_ = auVar87._12_4_ * auVar76._12_4_;
  auVar93._16_4_ = auVar87._16_4_ * 0.0;
  auVar93._20_4_ = auVar87._20_4_ * 0.0;
  auVar93._24_4_ = auVar87._24_4_ * 0.0;
  auVar93._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x17 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar1));
  auVar96._0_4_ = auVar76._0_4_ * auVar87._0_4_;
  auVar96._4_4_ = auVar76._4_4_ * auVar87._4_4_;
  auVar96._8_4_ = auVar76._8_4_ * auVar87._8_4_;
  auVar96._12_4_ = auVar76._12_4_ * auVar87._12_4_;
  auVar96._16_4_ = auVar87._16_4_ * 0.0;
  auVar96._20_4_ = auVar87._20_4_ * 0.0;
  auVar96._24_4_ = auVar87._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar87 = vpminsd_avx2(auVar91,auVar99);
  auVar85 = vpminsd_avx2(auVar92,auVar97);
  auVar87 = vmaxps_avx(auVar87,auVar85);
  auVar85 = vpminsd_avx2(auVar93,auVar96);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar88._4_4_ = uVar162;
  auVar88._0_4_ = uVar162;
  auVar88._8_4_ = uVar162;
  auVar88._12_4_ = uVar162;
  auVar88._16_4_ = uVar162;
  auVar88._20_4_ = uVar162;
  auVar88._24_4_ = uVar162;
  auVar88._28_4_ = uVar162;
  auVar85 = vmaxps_avx512vl(auVar85,auVar88);
  auVar87 = vmaxps_avx(auVar87,auVar85);
  auVar85._8_4_ = 0x3f7ffffa;
  auVar85._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar85._12_4_ = 0x3f7ffffa;
  auVar85._16_4_ = 0x3f7ffffa;
  auVar85._20_4_ = 0x3f7ffffa;
  auVar85._24_4_ = 0x3f7ffffa;
  auVar85._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar87,auVar85);
  auVar87 = vpmaxsd_avx2(auVar91,auVar99);
  auVar85 = vpmaxsd_avx2(auVar92,auVar97);
  auVar87 = vminps_avx(auVar87,auVar85);
  auVar85 = vpmaxsd_avx2(auVar93,auVar96);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar89._4_4_ = uVar162;
  auVar89._0_4_ = uVar162;
  auVar89._8_4_ = uVar162;
  auVar89._12_4_ = uVar162;
  auVar89._16_4_ = uVar162;
  auVar89._20_4_ = uVar162;
  auVar89._24_4_ = uVar162;
  auVar89._28_4_ = uVar162;
  auVar85 = vminps_avx512vl(auVar85,auVar89);
  auVar87 = vminps_avx(auVar87,auVar85);
  auVar90._8_4_ = 0x3f800003;
  auVar90._0_8_ = 0x3f8000033f800003;
  auVar90._12_4_ = 0x3f800003;
  auVar90._16_4_ = 0x3f800003;
  auVar90._20_4_ = 0x3f800003;
  auVar90._24_4_ = 0x3f800003;
  auVar90._28_4_ = 0x3f800003;
  auVar87 = vmulps_avx512vl(auVar87,auVar90);
  uVar15 = vcmpps_avx512vl(local_300,auVar87,2);
  uVar18 = vpcmpgtd_avx512vl(auVar86,_DAT_01fb4ba0);
  local_748 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar15 & (byte)uVar18));
  local_550 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_750 = prim;
LAB_01a989f8:
  if (local_748 == 0) {
    return;
  }
  lVar66 = 0;
  for (uVar68 = local_748; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    lVar66 = lVar66 + 1;
  }
  uVar2 = *(uint *)(prim + 2);
  uVar3 = *(uint *)(prim + lVar66 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar2].ptr;
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar3);
  p_Var6 = pGVar5[1].intersectionFilterN;
  lVar66 = *(long *)&pGVar5[1].time_range.upper;
  auVar74 = *(undefined1 (*) [16])(lVar66 + (long)p_Var6 * uVar68);
  auVar75 = *(undefined1 (*) [16])(lVar66 + (uVar68 + 1) * (long)p_Var6);
  auVar76 = *(undefined1 (*) [16])(lVar66 + (uVar68 + 2) * (long)p_Var6);
  local_748 = local_748 - 1 & local_748;
  auVar77 = *(undefined1 (*) [16])(lVar66 + (uVar68 + 3) * (long)p_Var6);
  if (local_748 != 0) {
    uVar69 = local_748 - 1 & local_748;
    for (uVar68 = local_748; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    }
    if (uVar69 != 0) {
      for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar1 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar241._4_4_ = uVar162;
  auVar241._0_4_ = uVar162;
  auVar241._8_4_ = uVar162;
  auVar241._12_4_ = uVar162;
  local_460._16_4_ = uVar162;
  local_460._0_16_ = auVar241;
  local_460._20_4_ = uVar162;
  local_460._24_4_ = uVar162;
  local_460._28_4_ = uVar162;
  auVar245 = ZEXT3264(local_460);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar246._4_4_ = uVar162;
  auVar246._0_4_ = uVar162;
  auVar246._8_4_ = uVar162;
  auVar246._12_4_ = uVar162;
  local_380._16_4_ = uVar162;
  local_380._0_16_ = auVar246;
  local_380._20_4_ = uVar162;
  local_380._24_4_ = uVar162;
  local_380._28_4_ = uVar162;
  auVar72 = vunpcklps_avx(auVar241,auVar246);
  fVar229 = *(float *)(ray + k * 4 + 0x60);
  auVar247._4_4_ = fVar229;
  auVar247._0_4_ = fVar229;
  auVar247._8_4_ = fVar229;
  auVar247._12_4_ = fVar229;
  local_480._16_4_ = fVar229;
  local_480._0_16_ = auVar247;
  local_480._20_4_ = fVar229;
  local_480._24_4_ = fVar229;
  local_480._28_4_ = fVar229;
  local_6f0 = vinsertps_avx(auVar72,auVar247,0x28);
  auVar235 = ZEXT1664(local_6f0);
  auVar80._0_4_ = auVar74._0_4_ + auVar75._0_4_ + auVar76._0_4_ + auVar77._0_4_;
  auVar80._4_4_ = auVar74._4_4_ + auVar75._4_4_ + auVar76._4_4_ + auVar77._4_4_;
  auVar80._8_4_ = auVar74._8_4_ + auVar75._8_4_ + auVar76._8_4_ + auVar77._8_4_;
  auVar80._12_4_ = auVar74._12_4_ + auVar75._12_4_ + auVar76._12_4_ + auVar77._12_4_;
  auVar81._8_4_ = 0x3e800000;
  auVar81._0_8_ = 0x3e8000003e800000;
  auVar81._12_4_ = 0x3e800000;
  auVar72 = vmulps_avx512vl(auVar80,auVar81);
  auVar72 = vsubps_avx(auVar72,auVar1);
  auVar72 = vdpps_avx(auVar72,local_6f0,0x7f);
  local_700 = vdpps_avx(local_6f0,local_6f0,0x7f);
  fVar140 = *(float *)(ray + k * 4 + 0x30);
  auVar240 = ZEXT464((uint)fVar140);
  auVar224._4_12_ = ZEXT812(0) << 0x20;
  auVar224._0_4_ = local_700._0_4_;
  auVar73 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar224);
  auVar78 = vfnmadd213ss_fma(auVar73,local_700,ZEXT416(0x40000000));
  local_2e0 = auVar72._0_4_ * auVar73._0_4_ * auVar78._0_4_;
  auVar225._4_4_ = local_2e0;
  auVar225._0_4_ = local_2e0;
  auVar225._8_4_ = local_2e0;
  auVar225._12_4_ = local_2e0;
  fStack_410 = local_2e0;
  _local_420 = auVar225;
  fStack_40c = local_2e0;
  fStack_408 = local_2e0;
  fStack_404 = local_2e0;
  auVar72 = vfmadd231ps_fma(auVar1,local_6f0,auVar225);
  auVar72 = vblendps_avx(auVar72,ZEXT816(0) << 0x40,8);
  auVar74 = vsubps_avx(auVar74,auVar72);
  auVar76 = vsubps_avx(auVar76,auVar72);
  auVar228 = ZEXT1664(auVar76);
  auVar75 = vsubps_avx(auVar75,auVar72);
  auVar231 = ZEXT1664(auVar75);
  auVar77 = vsubps_avx(auVar77,auVar72);
  auVar87 = vbroadcastss_avx512vl(auVar74);
  auVar107._8_4_ = 1;
  auVar107._0_8_ = 0x100000001;
  auVar107._12_4_ = 1;
  auVar107._16_4_ = 1;
  auVar107._20_4_ = 1;
  auVar107._24_4_ = 1;
  auVar107._28_4_ = 1;
  local_680 = ZEXT1632(auVar74);
  auVar85 = vpermps_avx512vl(auVar107,local_680);
  auVar108._8_4_ = 2;
  auVar108._0_8_ = 0x200000002;
  auVar108._12_4_ = 2;
  auVar108._16_4_ = 2;
  auVar108._20_4_ = 2;
  auVar108._24_4_ = 2;
  auVar108._28_4_ = 2;
  auVar88 = vpermps_avx512vl(auVar108,local_680);
  auVar109._8_4_ = 3;
  auVar109._0_8_ = 0x300000003;
  auVar109._12_4_ = 3;
  auVar109._16_4_ = 3;
  auVar109._20_4_ = 3;
  auVar109._24_4_ = 3;
  auVar109._28_4_ = 3;
  auVar89 = vpermps_avx512vl(auVar109,local_680);
  auVar90 = vbroadcastss_avx512vl(auVar75);
  local_6c0 = ZEXT1632(auVar75);
  auVar86 = vpermps_avx512vl(auVar107,local_6c0);
  auVar91 = vpermps_avx512vl(auVar108,local_6c0);
  auVar92 = vpermps_avx512vl(auVar109,local_6c0);
  auVar93 = vbroadcastss_avx512vl(auVar76);
  local_6a0 = ZEXT1632(auVar76);
  auVar94 = vpermps_avx512vl(auVar107,local_6a0);
  local_840 = vpermps_avx512vl(auVar108,local_6a0);
  auVar250 = ZEXT3264(local_840);
  auVar95 = vpermps_avx512vl(auVar109,local_6a0);
  local_260 = vbroadcastss_avx512vl(auVar77);
  _local_6e0 = ZEXT1632(auVar77);
  local_240 = vpermps_avx512vl(auVar107,_local_6e0);
  local_2a0 = vpermps_avx2(auVar108,_local_6e0);
  local_2c0 = vpermps_avx2(auVar109,_local_6e0);
  auVar74 = vfmadd231ps_fma(ZEXT432((uint)(fVar229 * fVar229)),local_380,local_380);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),local_460,local_460);
  local_220._0_4_ = auVar74._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar106._8_4_ = 0x7fffffff;
  auVar106._0_8_ = 0x7fffffff7fffffff;
  auVar106._12_4_ = 0x7fffffff;
  auVar106._16_4_ = 0x7fffffff;
  auVar106._20_4_ = 0x7fffffff;
  auVar106._24_4_ = 0x7fffffff;
  auVar106._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar106);
  local_650 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar140 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_530 = vpbroadcastd_avx512vl();
  uVar68 = 0;
  local_a44 = 1;
  local_540 = vpbroadcastd_avx512vl();
  auVar74 = vsqrtss_avx(local_700,local_700);
  local_844 = auVar74._0_4_;
  auVar74 = vsqrtss_avx(local_700,local_700);
  local_848 = auVar74._0_4_;
  local_3b0 = ZEXT816(0x3f80000000000000);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar251 = ZEXT3264(auVar84);
  auVar222 = ZEXT3264(_DAT_01f7b040);
  local_280 = local_240;
  do {
    auVar74 = vmovshdup_avx(local_3b0);
    auVar74 = vsubps_avx(auVar74,local_3b0);
    local_720._0_4_ = auVar74._0_4_;
    fVar14 = local_720._0_4_ * 0.04761905;
    uVar162 = local_3b0._0_4_;
    local_780._4_4_ = uVar162;
    local_780._0_4_ = uVar162;
    local_780._8_4_ = uVar162;
    local_780._12_4_ = uVar162;
    local_780._16_4_ = uVar162;
    local_780._20_4_ = uVar162;
    local_780._24_4_ = uVar162;
    local_780._28_4_ = uVar162;
    local_720._4_4_ = local_720._0_4_;
    local_720._8_4_ = local_720._0_4_;
    local_720._12_4_ = local_720._0_4_;
    local_720._16_4_ = local_720._0_4_;
    local_720._20_4_ = local_720._0_4_;
    local_720._24_4_ = local_720._0_4_;
    local_720._28_4_ = local_720._0_4_;
    auVar74 = vfmadd231ps_fma(local_780,local_720,auVar222._0_32_);
    auVar82 = vsubps_avx512vl(auVar251._0_32_,ZEXT1632(auVar74));
    fVar229 = auVar82._0_4_;
    fVar233 = auVar82._4_4_;
    fVar209 = auVar82._8_4_;
    fVar211 = auVar82._12_4_;
    fVar218 = auVar82._16_4_;
    fVar237 = auVar82._20_4_;
    fVar179 = auVar82._24_4_;
    fVar141 = fVar229 * fVar229 * fVar229;
    fVar156 = fVar233 * fVar233 * fVar233;
    auVar115._4_4_ = fVar156;
    auVar115._0_4_ = fVar141;
    fVar157 = fVar209 * fVar209 * fVar209;
    auVar115._8_4_ = fVar157;
    fVar158 = fVar211 * fVar211 * fVar211;
    auVar115._12_4_ = fVar158;
    fVar159 = fVar218 * fVar218 * fVar218;
    auVar115._16_4_ = fVar159;
    fVar160 = fVar237 * fVar237 * fVar237;
    auVar115._20_4_ = fVar160;
    fVar161 = fVar179 * fVar179 * fVar179;
    auVar115._24_4_ = fVar161;
    auVar115._28_4_ = local_720._0_4_;
    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar83 = vmulps_avx512vl(auVar115,auVar84);
    fVar232 = auVar74._0_4_;
    fVar234 = auVar74._4_4_;
    fVar210 = auVar74._8_4_;
    fVar201 = auVar74._12_4_;
    fVar178 = fVar232 * fVar232 * fVar232;
    fVar198 = fVar234 * fVar234 * fVar234;
    fVar199 = fVar210 * fVar210 * fVar210;
    fVar200 = fVar201 * fVar201 * fVar201;
    auVar236._0_4_ = fVar232 * fVar229;
    auVar236._4_4_ = fVar234 * fVar233;
    auVar236._8_4_ = fVar210 * fVar209;
    auVar236._12_4_ = fVar201 * fVar211;
    auVar236._16_4_ = fVar218 * 0.0;
    auVar236._20_4_ = fVar237 * 0.0;
    auVar236._28_36_ = auVar235._28_36_;
    auVar236._24_4_ = fVar179 * 0.0;
    auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar200,CONCAT48(fVar199,CONCAT44(fVar198,fVar178))
                                                )),auVar84);
    fVar239 = auVar96._28_4_ + local_720._0_4_;
    fVar32 = auVar240._28_4_;
    fVar223 = fVar239 + fVar32 + auVar222._28_4_;
    auVar116._4_4_ = fVar156 * 0.16666667;
    auVar116._0_4_ = fVar141 * 0.16666667;
    auVar116._8_4_ = fVar157 * 0.16666667;
    auVar116._12_4_ = fVar158 * 0.16666667;
    auVar116._16_4_ = fVar159 * 0.16666667;
    auVar116._20_4_ = fVar160 * 0.16666667;
    auVar116._24_4_ = fVar161 * 0.16666667;
    auVar116._28_4_ = fVar239;
    auVar117._4_4_ =
         (auVar236._4_4_ * fVar233 * 12.0 + auVar236._4_4_ * fVar234 * 6.0 + fVar198 + auVar83._4_4_
         ) * 0.16666667;
    auVar117._0_4_ =
         (auVar236._0_4_ * fVar229 * 12.0 + auVar236._0_4_ * fVar232 * 6.0 + fVar178 + auVar83._0_4_
         ) * 0.16666667;
    auVar117._8_4_ =
         (auVar236._8_4_ * fVar209 * 12.0 + auVar236._8_4_ * fVar210 * 6.0 + fVar199 + auVar83._8_4_
         ) * 0.16666667;
    auVar117._12_4_ =
         (auVar236._12_4_ * fVar211 * 12.0 + auVar236._12_4_ * fVar201 * 6.0 +
         fVar200 + auVar83._12_4_) * 0.16666667;
    auVar117._16_4_ =
         (auVar236._16_4_ * fVar218 * 12.0 + auVar236._16_4_ * 0.0 * 6.0 + auVar83._16_4_ + 0.0) *
         0.16666667;
    auVar117._20_4_ =
         (auVar236._20_4_ * fVar237 * 12.0 + auVar236._20_4_ * 0.0 * 6.0 + auVar83._20_4_ + 0.0) *
         0.16666667;
    auVar117._24_4_ =
         (auVar236._24_4_ * fVar179 * 12.0 + auVar236._24_4_ * 0.0 * 6.0 + auVar83._24_4_ + 0.0) *
         0.16666667;
    auVar117._28_4_ = fVar32;
    auVar118._4_4_ =
         (auVar96._4_4_ + fVar156 + auVar236._4_4_ * fVar234 * 12.0 + auVar236._4_4_ * fVar233 * 6.0
         ) * 0.16666667;
    auVar118._0_4_ =
         (auVar96._0_4_ + fVar141 + auVar236._0_4_ * fVar232 * 12.0 + auVar236._0_4_ * fVar229 * 6.0
         ) * 0.16666667;
    auVar118._8_4_ =
         (auVar96._8_4_ + fVar157 + auVar236._8_4_ * fVar210 * 12.0 + auVar236._8_4_ * fVar209 * 6.0
         ) * 0.16666667;
    auVar118._12_4_ =
         (auVar96._12_4_ + fVar158 +
         auVar236._12_4_ * fVar201 * 12.0 + auVar236._12_4_ * fVar211 * 6.0) * 0.16666667;
    auVar118._16_4_ =
         (auVar96._16_4_ + fVar159 + auVar236._16_4_ * 0.0 * 12.0 + auVar236._16_4_ * fVar218 * 6.0)
         * 0.16666667;
    auVar118._20_4_ =
         (auVar96._20_4_ + fVar160 + auVar236._20_4_ * 0.0 * 12.0 + auVar236._20_4_ * fVar237 * 6.0)
         * 0.16666667;
    auVar118._24_4_ =
         (auVar96._24_4_ + fVar161 + auVar236._24_4_ * 0.0 * 12.0 + auVar236._24_4_ * fVar179 * 6.0)
         * 0.16666667;
    auVar118._28_4_ = auVar245._28_4_;
    fVar178 = fVar178 * 0.16666667;
    fVar198 = fVar198 * 0.16666667;
    fVar199 = fVar199 * 0.16666667;
    fVar200 = fVar200 * 0.16666667;
    auVar119._28_4_ = fVar223;
    auVar119._0_28_ = ZEXT1628(CONCAT412(fVar200,CONCAT48(fVar199,CONCAT44(fVar198,fVar178))));
    auVar83 = vmulps_avx512vl(local_260,auVar119);
    auVar96 = vmulps_avx512vl(local_280,auVar119);
    auVar122._4_4_ = local_2a0._4_4_ * fVar198;
    auVar122._0_4_ = local_2a0._0_4_ * fVar178;
    auVar122._8_4_ = local_2a0._8_4_ * fVar199;
    auVar122._12_4_ = local_2a0._12_4_ * fVar200;
    auVar122._16_4_ = local_2a0._16_4_ * 0.0;
    auVar122._20_4_ = local_2a0._20_4_ * 0.0;
    auVar122._24_4_ = local_2a0._24_4_ * 0.0;
    auVar122._28_4_ = local_720._0_4_;
    auVar123._4_4_ = local_2c0._4_4_ * fVar198;
    auVar123._0_4_ = local_2c0._0_4_ * fVar178;
    auVar123._8_4_ = local_2c0._8_4_ * fVar199;
    auVar123._12_4_ = local_2c0._12_4_ * fVar200;
    auVar123._16_4_ = local_2c0._16_4_ * 0.0;
    auVar123._20_4_ = local_2c0._20_4_ * 0.0;
    auVar123._24_4_ = local_2c0._24_4_ * 0.0;
    auVar123._28_4_ = fVar223;
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar118,auVar93);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar118,auVar94);
    auVar97 = vfmadd231ps_avx512vl(auVar122,auVar118,auVar250._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar123,auVar95,auVar118);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar117,auVar90);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar117,auVar86);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar117,auVar91);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar92,auVar117);
    auVar99 = vfmadd231ps_avx512vl(auVar83,auVar116,auVar87);
    auVar100 = vfmadd231ps_avx512vl(auVar96,auVar116,auVar85);
    auVar101 = vfmadd231ps_avx512vl(auVar97,auVar116,auVar88);
    auVar83 = vfmadd231ps_avx512vl(auVar98,auVar89,auVar116);
    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar96 = vxorps_avx512vl(auVar82,auVar102);
    auVar97 = vxorps_avx512vl(ZEXT1632(auVar74),auVar102);
    auVar216._0_4_ = auVar97._0_4_ * fVar232;
    auVar216._4_4_ = auVar97._4_4_ * fVar234;
    auVar216._8_4_ = auVar97._8_4_ * fVar210;
    auVar216._12_4_ = auVar97._12_4_ * fVar201;
    auVar216._16_4_ = auVar97._16_4_ * 0.0;
    auVar216._20_4_ = auVar97._20_4_ * 0.0;
    auVar216._24_4_ = auVar97._24_4_ * 0.0;
    auVar216._28_4_ = 0;
    auVar97 = vmulps_avx512vl(auVar236._0_32_,auVar84);
    auVar84 = vsubps_avx(auVar216,auVar97);
    auVar33._4_4_ = auVar96._4_4_ * fVar233 * 0.5;
    auVar33._0_4_ = auVar96._0_4_ * fVar229 * 0.5;
    auVar33._8_4_ = auVar96._8_4_ * fVar209 * 0.5;
    auVar33._12_4_ = auVar96._12_4_ * fVar211 * 0.5;
    auVar33._16_4_ = auVar96._16_4_ * fVar218 * 0.5;
    auVar33._20_4_ = auVar96._20_4_ * fVar237 * 0.5;
    auVar33._24_4_ = auVar96._24_4_ * fVar179 * 0.5;
    auVar33._28_4_ = auVar82._28_4_;
    auVar34._4_4_ = auVar84._4_4_ * 0.5;
    auVar34._0_4_ = auVar84._0_4_ * 0.5;
    auVar34._8_4_ = auVar84._8_4_ * 0.5;
    auVar34._12_4_ = auVar84._12_4_ * 0.5;
    auVar34._16_4_ = auVar84._16_4_ * 0.5;
    auVar34._20_4_ = auVar84._20_4_ * 0.5;
    auVar34._24_4_ = auVar84._24_4_ * 0.5;
    auVar34._28_4_ = auVar84._28_4_;
    auVar35._4_4_ = (auVar97._4_4_ + fVar233 * fVar233) * 0.5;
    auVar35._0_4_ = (auVar97._0_4_ + fVar229 * fVar229) * 0.5;
    auVar35._8_4_ = (auVar97._8_4_ + fVar209 * fVar209) * 0.5;
    auVar35._12_4_ = (auVar97._12_4_ + fVar211 * fVar211) * 0.5;
    auVar35._16_4_ = (auVar97._16_4_ + fVar218 * fVar218) * 0.5;
    auVar35._20_4_ = (auVar97._20_4_ + fVar237 * fVar237) * 0.5;
    auVar35._24_4_ = (auVar97._24_4_ + fVar179 * fVar179) * 0.5;
    auVar35._28_4_ = auVar97._28_4_ + auVar228._28_4_;
    fVar229 = fVar232 * fVar232 * 0.5;
    fVar232 = fVar234 * fVar234 * 0.5;
    fVar233 = fVar210 * fVar210 * 0.5;
    fVar234 = fVar201 * fVar201 * 0.5;
    auVar36._28_4_ = auVar231._28_4_;
    auVar36._0_28_ = ZEXT1628(CONCAT412(fVar234,CONCAT48(fVar233,CONCAT44(fVar232,fVar229))));
    auVar84 = vmulps_avx512vl(local_260,auVar36);
    auVar82 = vmulps_avx512vl(local_280,auVar36);
    auVar37._4_4_ = local_2a0._4_4_ * fVar232;
    auVar37._0_4_ = local_2a0._0_4_ * fVar229;
    auVar37._8_4_ = local_2a0._8_4_ * fVar233;
    auVar37._12_4_ = local_2a0._12_4_ * fVar234;
    auVar37._16_4_ = local_2a0._16_4_ * 0.0;
    auVar37._20_4_ = local_2a0._20_4_ * 0.0;
    auVar37._24_4_ = local_2a0._24_4_ * 0.0;
    auVar37._28_4_ = fVar32;
    auVar38._4_4_ = fVar232 * local_2c0._4_4_;
    auVar38._0_4_ = fVar229 * local_2c0._0_4_;
    auVar38._8_4_ = fVar233 * local_2c0._8_4_;
    auVar38._12_4_ = fVar234 * local_2c0._12_4_;
    auVar38._16_4_ = local_2c0._16_4_ * 0.0;
    auVar38._20_4_ = local_2c0._20_4_ * 0.0;
    auVar38._24_4_ = local_2c0._24_4_ * 0.0;
    auVar38._28_4_ = auVar231._28_4_;
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar35,auVar93);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar35,auVar94);
    auVar96 = vfmadd231ps_avx512vl(auVar37,auVar35,auVar250._0_32_);
    auVar74 = vfmadd231ps_fma(auVar38,auVar95,auVar35);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar34,auVar90);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar34,auVar86);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar34,auVar91);
    auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar92,auVar34);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar33,auVar87);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar33,auVar85);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar33,auVar88);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar89,auVar33);
    auVar39._4_4_ = auVar84._4_4_ * fVar14;
    auVar39._0_4_ = auVar84._0_4_ * fVar14;
    auVar39._8_4_ = auVar84._8_4_ * fVar14;
    auVar39._12_4_ = auVar84._12_4_ * fVar14;
    auVar39._16_4_ = auVar84._16_4_ * fVar14;
    auVar39._20_4_ = auVar84._20_4_ * fVar14;
    auVar39._24_4_ = auVar84._24_4_ * fVar14;
    auVar39._28_4_ = auVar95._28_4_;
    auVar245 = ZEXT3264(auVar39);
    auVar40._4_4_ = auVar82._4_4_ * fVar14;
    auVar40._0_4_ = auVar82._0_4_ * fVar14;
    auVar40._8_4_ = auVar82._8_4_ * fVar14;
    auVar40._12_4_ = auVar82._12_4_ * fVar14;
    auVar40._16_4_ = auVar82._16_4_ * fVar14;
    auVar40._20_4_ = auVar82._20_4_ * fVar14;
    auVar40._24_4_ = auVar82._24_4_ * fVar14;
    auVar40._28_4_ = 0x3e2aaaab;
    auVar41._4_4_ = auVar96._4_4_ * fVar14;
    auVar41._0_4_ = auVar96._0_4_ * fVar14;
    auVar41._8_4_ = auVar96._8_4_ * fVar14;
    auVar41._12_4_ = auVar96._12_4_ * fVar14;
    auVar41._16_4_ = auVar96._16_4_ * fVar14;
    auVar41._20_4_ = auVar96._20_4_ * fVar14;
    auVar41._24_4_ = auVar96._24_4_ * fVar14;
    auVar41._28_4_ = 0x40c00000;
    fVar229 = auVar97._0_4_ * fVar14;
    fVar232 = auVar97._4_4_ * fVar14;
    auVar42._4_4_ = fVar232;
    auVar42._0_4_ = fVar229;
    fVar233 = auVar97._8_4_ * fVar14;
    auVar42._8_4_ = fVar233;
    fVar234 = auVar97._12_4_ * fVar14;
    auVar42._12_4_ = fVar234;
    fVar209 = auVar97._16_4_ * fVar14;
    auVar42._16_4_ = fVar209;
    fVar210 = auVar97._20_4_ * fVar14;
    auVar42._20_4_ = fVar210;
    fVar211 = auVar97._24_4_ * fVar14;
    auVar42._24_4_ = fVar211;
    auVar42._28_4_ = fVar14;
    auVar74 = vxorps_avx512vl(auVar251._0_16_,auVar251._0_16_);
    auVar103 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar235 = ZEXT3264(auVar103);
    auVar104 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar96 = ZEXT1632(auVar74);
    auVar105 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,auVar96);
    auVar240 = ZEXT3264(auVar105);
    auVar217._0_4_ = fVar229 + auVar83._0_4_;
    auVar217._4_4_ = fVar232 + auVar83._4_4_;
    auVar217._8_4_ = fVar233 + auVar83._8_4_;
    auVar217._12_4_ = fVar234 + auVar83._12_4_;
    auVar217._16_4_ = fVar209 + auVar83._16_4_;
    auVar217._20_4_ = fVar210 + auVar83._20_4_;
    auVar217._24_4_ = fVar211 + auVar83._24_4_;
    auVar217._28_4_ = fVar14 + auVar83._28_4_;
    auVar84 = vmaxps_avx(auVar83,auVar217);
    auVar82 = vminps_avx(auVar83,auVar217);
    auVar106 = vpermt2ps_avx512vl(auVar83,_DAT_01fb9fc0,auVar96);
    auVar107 = vpermt2ps_avx512vl(auVar39,_DAT_01fb9fc0,auVar96);
    auVar108 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9fc0,auVar96);
    auVar122 = ZEXT1632(auVar74);
    auVar109 = vpermt2ps_avx512vl(auVar41,_DAT_01fb9fc0,auVar122);
    auVar83 = vpermt2ps_avx512vl(auVar42,_DAT_01fb9fc0,auVar122);
    auVar110 = vsubps_avx512vl(auVar106,auVar83);
    auVar83 = vsubps_avx(auVar103,auVar99);
    auVar231 = ZEXT3264(auVar83);
    auVar96 = vsubps_avx(auVar104,auVar100);
    auVar228 = ZEXT3264(auVar96);
    auVar97 = vsubps_avx(auVar105,auVar101);
    auVar98 = vmulps_avx512vl(auVar96,auVar41);
    auVar98 = vfmsub231ps_avx512vl(auVar98,auVar40,auVar97);
    auVar111 = vmulps_avx512vl(auVar97,auVar39);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar41,auVar83);
    auVar112 = vmulps_avx512vl(auVar83,auVar40);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar39,auVar96);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar98,auVar98);
    auVar98 = vmulps_avx512vl(auVar97,auVar97);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,auVar96);
    auVar113 = vfmadd231ps_avx512vl(auVar98,auVar83,auVar83);
    auVar112 = vrcp14ps_avx512vl(auVar113);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar114 = vfnmadd213ps_avx512vl(auVar112,auVar113,auVar98);
    auVar112 = vfmadd132ps_avx512vl(auVar114,auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar111,auVar112);
    auVar114 = vmulps_avx512vl(auVar96,auVar109);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar108,auVar97);
    auVar115 = vmulps_avx512vl(auVar97,auVar107);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar109,auVar83);
    auVar116 = vmulps_avx512vl(auVar83,auVar108);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar107,auVar96);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar112 = vmulps_avx512vl(auVar114,auVar112);
    auVar111 = vmaxps_avx512vl(auVar111,auVar112);
    auVar111 = vsqrtps_avx512vl(auVar111);
    auVar112 = vmaxps_avx512vl(auVar110,auVar106);
    auVar84 = vmaxps_avx512vl(auVar84,auVar112);
    auVar114 = vaddps_avx512vl(auVar111,auVar84);
    auVar84 = vminps_avx512vl(auVar110,auVar106);
    auVar84 = vminps_avx(auVar82,auVar84);
    auVar84 = vsubps_avx512vl(auVar84,auVar111);
    auVar110._8_4_ = 0x3f800002;
    auVar110._0_8_ = 0x3f8000023f800002;
    auVar110._12_4_ = 0x3f800002;
    auVar110._16_4_ = 0x3f800002;
    auVar110._20_4_ = 0x3f800002;
    auVar110._24_4_ = 0x3f800002;
    auVar110._28_4_ = 0x3f800002;
    auVar82 = vmulps_avx512vl(auVar114,auVar110);
    auVar111._8_4_ = 0x3f7ffffc;
    auVar111._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar111._12_4_ = 0x3f7ffffc;
    auVar111._16_4_ = 0x3f7ffffc;
    auVar111._20_4_ = 0x3f7ffffc;
    auVar111._24_4_ = 0x3f7ffffc;
    auVar111._28_4_ = 0x3f7ffffc;
    auVar84 = vmulps_avx512vl(auVar84,auVar111);
    auVar82 = vmulps_avx512vl(auVar82,auVar82);
    auVar106 = vrsqrt14ps_avx512vl(auVar113);
    auVar112._8_4_ = 0xbf000000;
    auVar112._0_8_ = 0xbf000000bf000000;
    auVar112._12_4_ = 0xbf000000;
    auVar112._16_4_ = 0xbf000000;
    auVar112._20_4_ = 0xbf000000;
    auVar112._24_4_ = 0xbf000000;
    auVar112._28_4_ = 0xbf000000;
    auVar110 = vmulps_avx512vl(auVar113,auVar112);
    fVar229 = auVar106._0_4_;
    fVar232 = auVar106._4_4_;
    fVar233 = auVar106._8_4_;
    fVar234 = auVar106._12_4_;
    fVar209 = auVar106._16_4_;
    fVar210 = auVar106._20_4_;
    fVar211 = auVar106._24_4_;
    auVar43._4_4_ = fVar232 * fVar232 * fVar232 * auVar110._4_4_;
    auVar43._0_4_ = fVar229 * fVar229 * fVar229 * auVar110._0_4_;
    auVar43._8_4_ = fVar233 * fVar233 * fVar233 * auVar110._8_4_;
    auVar43._12_4_ = fVar234 * fVar234 * fVar234 * auVar110._12_4_;
    auVar43._16_4_ = fVar209 * fVar209 * fVar209 * auVar110._16_4_;
    auVar43._20_4_ = fVar210 * fVar210 * fVar210 * auVar110._20_4_;
    auVar43._24_4_ = fVar211 * fVar211 * fVar211 * auVar110._24_4_;
    auVar43._28_4_ = auVar114._28_4_;
    auVar113._8_4_ = 0x3fc00000;
    auVar113._0_8_ = 0x3fc000003fc00000;
    auVar113._12_4_ = 0x3fc00000;
    auVar113._16_4_ = 0x3fc00000;
    auVar113._20_4_ = 0x3fc00000;
    auVar113._24_4_ = 0x3fc00000;
    auVar113._28_4_ = 0x3fc00000;
    auVar106 = vfmadd231ps_avx512vl(auVar43,auVar106,auVar113);
    auVar110 = vmulps_avx512vl(auVar83,auVar106);
    auVar111 = vmulps_avx512vl(auVar96,auVar106);
    auVar112 = vmulps_avx512vl(auVar97,auVar106);
    auVar113 = vsubps_avx512vl(auVar122,auVar99);
    auVar115 = vsubps_avx512vl(auVar122,auVar100);
    auVar116 = vsubps_avx512vl(auVar122,auVar101);
    auVar114 = vmulps_avx512vl(local_480,auVar116);
    auVar114 = vfmadd231ps_avx512vl(auVar114,local_380,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar114,local_460,auVar113);
    auVar117 = vmulps_avx512vl(auVar116,auVar116);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar115,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,auVar113);
    auVar118 = vmulps_avx512vl(local_480,auVar112);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar111,local_380);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar110,local_460);
    auVar112 = vmulps_avx512vl(auVar116,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar115,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar113,auVar110);
    auVar111 = vmulps_avx512vl(auVar118,auVar118);
    auVar112 = vsubps_avx512vl(local_220,auVar111);
    auVar119 = vmulps_avx512vl(auVar118,auVar110);
    auVar114 = vsubps_avx512vl(auVar114,auVar119);
    auVar119 = vaddps_avx512vl(auVar114,auVar114);
    auVar114 = vmulps_avx512vl(auVar110,auVar110);
    local_740 = vsubps_avx512vl(auVar117,auVar114);
    auVar82 = vsubps_avx512vl(local_740,auVar82);
    local_7a0 = vmulps_avx512vl(auVar119,auVar119);
    auVar114._8_4_ = 0x40800000;
    auVar114._0_8_ = 0x4080000040800000;
    auVar114._12_4_ = 0x40800000;
    auVar114._16_4_ = 0x40800000;
    auVar114._20_4_ = 0x40800000;
    auVar114._24_4_ = 0x40800000;
    auVar114._28_4_ = 0x40800000;
    _local_7c0 = vmulps_avx512vl(auVar112,auVar114);
    auVar114 = vmulps_avx512vl(_local_7c0,auVar82);
    auVar114 = vsubps_avx512vl(local_7a0,auVar114);
    uVar69 = vcmpps_avx512vl(auVar114,auVar122,5);
    bVar63 = (byte)uVar69;
    if (bVar63 == 0) {
LAB_01a9978e:
      auVar251 = ZEXT3264(auVar98);
      auVar222 = ZEXT3264(_DAT_01f7b040);
      auVar250 = ZEXT3264(local_840);
    }
    else {
      auVar114 = vsqrtps_avx512vl(auVar114);
      auVar117 = vaddps_avx512vl(auVar112,auVar112);
      local_7e0 = vrcp14ps_avx512vl(auVar117);
      auVar98 = vfnmadd213ps_avx512vl(local_7e0,auVar117,auVar98);
      auVar98 = vfmadd132ps_avx512vl(auVar98,local_7e0,local_7e0);
      _local_5a0 = vxorps_avx512vl(auVar119,auVar102);
      auVar102 = vsubps_avx512vl(_local_5a0,auVar114);
      local_580 = vmulps_avx512vl(auVar102,auVar98);
      auVar102 = vsubps_avx512vl(auVar114,auVar119);
      local_5c0 = vmulps_avx512vl(auVar102,auVar98);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar102 = vblendmps_avx512vl(auVar98,local_580);
      auVar120._0_4_ =
           (uint)(bVar63 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar98._0_4_;
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar70 * auVar102._4_4_ | (uint)!bVar70 * auVar98._4_4_;
      bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar70 * auVar102._8_4_ | (uint)!bVar70 * auVar98._8_4_;
      bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar70 * auVar102._12_4_ | (uint)!bVar70 * auVar98._12_4_;
      bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar120._16_4_ = (uint)bVar70 * auVar102._16_4_ | (uint)!bVar70 * auVar98._16_4_;
      bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar120._20_4_ = (uint)bVar70 * auVar102._20_4_ | (uint)!bVar70 * auVar98._20_4_;
      bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar120._24_4_ = (uint)bVar70 * auVar102._24_4_ | (uint)!bVar70 * auVar98._24_4_;
      bVar70 = SUB81(uVar69 >> 7,0);
      auVar120._28_4_ = (uint)bVar70 * auVar102._28_4_ | (uint)!bVar70 * auVar98._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar102 = vblendmps_avx512vl(auVar98,local_5c0);
      auVar121._0_4_ =
           (uint)(bVar63 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar98._0_4_;
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar70 * auVar102._4_4_ | (uint)!bVar70 * auVar98._4_4_;
      bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar70 * auVar102._8_4_ | (uint)!bVar70 * auVar98._8_4_;
      bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar70 * auVar102._12_4_ | (uint)!bVar70 * auVar98._12_4_;
      bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar70 * auVar102._16_4_ | (uint)!bVar70 * auVar98._16_4_;
      bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar70 * auVar102._20_4_ | (uint)!bVar70 * auVar98._20_4_;
      bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar70 * auVar102._24_4_ | (uint)!bVar70 * auVar98._24_4_;
      bVar70 = SUB81(uVar69 >> 7,0);
      auVar121._28_4_ = (uint)bVar70 * auVar102._28_4_ | (uint)!bVar70 * auVar98._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar111,auVar98);
      local_5e0 = vmaxps_avx512vl(local_240,auVar98);
      auVar26._8_4_ = 0x36000000;
      auVar26._0_8_ = 0x3600000036000000;
      auVar26._12_4_ = 0x36000000;
      auVar26._16_4_ = 0x36000000;
      auVar26._20_4_ = 0x36000000;
      auVar26._24_4_ = 0x36000000;
      auVar26._28_4_ = 0x36000000;
      local_600 = vmulps_avx512vl(local_5e0,auVar26);
      vandps_avx512vl(auVar112,auVar98);
      uVar16 = vcmpps_avx512vl(local_600,local_600,1);
      uVar69 = uVar69 & uVar16;
      bVar67 = (byte)uVar69;
      if (bVar67 != 0) {
        uVar16 = vcmpps_avx512vl(auVar82,_DAT_01f7b000,2);
        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar102 = vblendmps_avx512vl(auVar82,auVar98);
        bVar65 = (byte)uVar16;
        uVar71 = (uint)(bVar65 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar65 & 1) * local_600._0_4_;
        bVar70 = (bool)((byte)(uVar16 >> 1) & 1);
        uVar133 = (uint)bVar70 * auVar102._4_4_ | (uint)!bVar70 * local_600._4_4_;
        bVar70 = (bool)((byte)(uVar16 >> 2) & 1);
        uVar134 = (uint)bVar70 * auVar102._8_4_ | (uint)!bVar70 * local_600._8_4_;
        bVar70 = (bool)((byte)(uVar16 >> 3) & 1);
        uVar135 = (uint)bVar70 * auVar102._12_4_ | (uint)!bVar70 * local_600._12_4_;
        bVar70 = (bool)((byte)(uVar16 >> 4) & 1);
        uVar136 = (uint)bVar70 * auVar102._16_4_ | (uint)!bVar70 * local_600._16_4_;
        bVar70 = (bool)((byte)(uVar16 >> 5) & 1);
        uVar137 = (uint)bVar70 * auVar102._20_4_ | (uint)!bVar70 * local_600._20_4_;
        bVar70 = (bool)((byte)(uVar16 >> 6) & 1);
        uVar138 = (uint)bVar70 * auVar102._24_4_ | (uint)!bVar70 * local_600._24_4_;
        bVar70 = SUB81(uVar16 >> 7,0);
        uVar139 = (uint)bVar70 * auVar102._28_4_ | (uint)!bVar70 * local_600._28_4_;
        auVar120._0_4_ = (bVar67 & 1) * uVar71 | !(bool)(bVar67 & 1) * auVar120._0_4_;
        bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar120._4_4_ = bVar70 * uVar133 | !bVar70 * auVar120._4_4_;
        bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar120._8_4_ = bVar70 * uVar134 | !bVar70 * auVar120._8_4_;
        bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar120._12_4_ = bVar70 * uVar135 | !bVar70 * auVar120._12_4_;
        bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar120._16_4_ = bVar70 * uVar136 | !bVar70 * auVar120._16_4_;
        bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar120._20_4_ = bVar70 * uVar137 | !bVar70 * auVar120._20_4_;
        bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar120._24_4_ = bVar70 * uVar138 | !bVar70 * auVar120._24_4_;
        bVar70 = SUB81(uVar69 >> 7,0);
        auVar120._28_4_ = bVar70 * uVar139 | !bVar70 * auVar120._28_4_;
        auVar82 = vblendmps_avx512vl(auVar98,auVar82);
        bVar70 = (bool)((byte)(uVar16 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar16 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar16 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar16 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar16 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar16 >> 6) & 1);
        bVar13 = SUB81(uVar16 >> 7,0);
        auVar121._0_4_ =
             (uint)(bVar67 & 1) *
             ((uint)(bVar65 & 1) * auVar82._0_4_ | !(bool)(bVar65 & 1) * uVar71) |
             !(bool)(bVar67 & 1) * auVar121._0_4_;
        bVar7 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar121._4_4_ =
             (uint)bVar7 * ((uint)bVar70 * auVar82._4_4_ | !bVar70 * uVar133) |
             !bVar7 * auVar121._4_4_;
        bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar121._8_4_ =
             (uint)bVar70 * ((uint)bVar8 * auVar82._8_4_ | !bVar8 * uVar134) |
             !bVar70 * auVar121._8_4_;
        bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar121._12_4_ =
             (uint)bVar70 * ((uint)bVar9 * auVar82._12_4_ | !bVar9 * uVar135) |
             !bVar70 * auVar121._12_4_;
        bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar121._16_4_ =
             (uint)bVar70 * ((uint)bVar10 * auVar82._16_4_ | !bVar10 * uVar136) |
             !bVar70 * auVar121._16_4_;
        bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar121._20_4_ =
             (uint)bVar70 * ((uint)bVar11 * auVar82._20_4_ | !bVar11 * uVar137) |
             !bVar70 * auVar121._20_4_;
        bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar121._24_4_ =
             (uint)bVar70 * ((uint)bVar12 * auVar82._24_4_ | !bVar12 * uVar138) |
             !bVar70 * auVar121._24_4_;
        bVar70 = SUB81(uVar69 >> 7,0);
        auVar121._28_4_ =
             (uint)bVar70 * ((uint)bVar13 * auVar82._28_4_ | !bVar13 * uVar139) |
             !bVar70 * auVar121._28_4_;
        bVar63 = (~bVar67 | bVar65) & bVar63;
      }
      if ((bVar63 & 0x7f) == 0) {
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar251 = ZEXT3264(auVar84);
        auVar222 = ZEXT3264(_DAT_01f7b040);
        auVar250 = ZEXT3264(local_840);
      }
      else {
        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar102 = vxorps_avx512vl(auVar109,auVar82);
        auVar107 = vxorps_avx512vl(auVar107,auVar82);
        auVar222 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
        auVar108 = vxorps_avx512vl(auVar108,auVar82);
        auVar74 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                                 ZEXT416((uint)local_650._0_4_));
        auVar98 = vbroadcastss_avx512vl(auVar74);
        auVar109 = vminps_avx512vl(auVar98,auVar121);
        auVar62._4_4_ = fStack_2dc;
        auVar62._0_4_ = local_2e0;
        auVar62._8_4_ = fStack_2d8;
        auVar62._12_4_ = fStack_2d4;
        auVar62._16_4_ = fStack_2d0;
        auVar62._20_4_ = fStack_2cc;
        auVar62._24_4_ = fStack_2c8;
        auVar62._28_4_ = fStack_2c4;
        auVar111 = vmaxps_avx512vl(auVar62,auVar120);
        auVar98 = vmulps_avx512vl(auVar41,auVar116);
        auVar98 = vfmadd213ps_avx512vl(auVar115,auVar40,auVar98);
        auVar74 = vfmadd213ps_fma(auVar113,auVar39,auVar98);
        auVar98 = vmulps_avx512vl(local_480,auVar41);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_380,auVar40);
        auVar112 = vfmadd231ps_avx512vl(auVar98,local_460,auVar39);
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar112,auVar113);
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar15 = vcmpps_avx512vl(auVar113,auVar114,1);
        auVar115 = vxorps_avx512vl(ZEXT1632(auVar74),auVar82);
        auVar116 = vrcp14ps_avx512vl(auVar112);
        auVar122 = vxorps_avx512vl(auVar112,auVar82);
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar123 = vfnmadd213ps_avx512vl(auVar116,auVar112,auVar98);
        auVar74 = vfmadd132ps_fma(auVar123,auVar116,auVar116);
        fVar229 = auVar74._0_4_ * auVar115._0_4_;
        fVar232 = auVar74._4_4_ * auVar115._4_4_;
        auVar44._4_4_ = fVar232;
        auVar44._0_4_ = fVar229;
        fVar233 = auVar74._8_4_ * auVar115._8_4_;
        auVar44._8_4_ = fVar233;
        fVar234 = auVar74._12_4_ * auVar115._12_4_;
        auVar44._12_4_ = fVar234;
        fVar209 = auVar115._16_4_ * 0.0;
        auVar44._16_4_ = fVar209;
        fVar210 = auVar115._20_4_ * 0.0;
        auVar44._20_4_ = fVar210;
        fVar211 = auVar115._24_4_ * 0.0;
        auVar44._24_4_ = fVar211;
        auVar44._28_4_ = auVar115._28_4_;
        uVar18 = vcmpps_avx512vl(auVar112,auVar122,1);
        bVar67 = (byte)uVar15 | (byte)uVar18;
        auVar248._8_4_ = 0xff800000;
        auVar248._0_8_ = 0xff800000ff800000;
        auVar248._12_4_ = 0xff800000;
        auVar248._16_4_ = 0xff800000;
        auVar248._20_4_ = 0xff800000;
        auVar248._24_4_ = 0xff800000;
        auVar248._28_4_ = 0xff800000;
        auVar123 = vblendmps_avx512vl(auVar44,auVar248);
        auVar124._0_4_ =
             (uint)(bVar67 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar116._0_4_;
        bVar70 = (bool)(bVar67 >> 1 & 1);
        auVar124._4_4_ = (uint)bVar70 * auVar123._4_4_ | (uint)!bVar70 * auVar116._4_4_;
        bVar70 = (bool)(bVar67 >> 2 & 1);
        auVar124._8_4_ = (uint)bVar70 * auVar123._8_4_ | (uint)!bVar70 * auVar116._8_4_;
        bVar70 = (bool)(bVar67 >> 3 & 1);
        auVar124._12_4_ = (uint)bVar70 * auVar123._12_4_ | (uint)!bVar70 * auVar116._12_4_;
        bVar70 = (bool)(bVar67 >> 4 & 1);
        auVar124._16_4_ = (uint)bVar70 * auVar123._16_4_ | (uint)!bVar70 * auVar116._16_4_;
        bVar70 = (bool)(bVar67 >> 5 & 1);
        auVar124._20_4_ = (uint)bVar70 * auVar123._20_4_ | (uint)!bVar70 * auVar116._20_4_;
        bVar70 = (bool)(bVar67 >> 6 & 1);
        auVar124._24_4_ = (uint)bVar70 * auVar123._24_4_ | (uint)!bVar70 * auVar116._24_4_;
        auVar124._28_4_ =
             (uint)(bVar67 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar116._28_4_;
        auVar111 = vmaxps_avx512vl(auVar111,auVar124);
        auVar245 = ZEXT3264(auVar111);
        uVar18 = vcmpps_avx512vl(auVar112,auVar122,6);
        bVar67 = (byte)uVar15 | (byte)uVar18;
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar125._0_4_ =
             (uint)(bVar67 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar67 & 1) * (int)fVar229;
        bVar70 = (bool)(bVar67 >> 1 & 1);
        auVar125._4_4_ = (uint)bVar70 * auVar112._4_4_ | (uint)!bVar70 * (int)fVar232;
        bVar70 = (bool)(bVar67 >> 2 & 1);
        auVar125._8_4_ = (uint)bVar70 * auVar112._8_4_ | (uint)!bVar70 * (int)fVar233;
        bVar70 = (bool)(bVar67 >> 3 & 1);
        auVar125._12_4_ = (uint)bVar70 * auVar112._12_4_ | (uint)!bVar70 * (int)fVar234;
        bVar70 = (bool)(bVar67 >> 4 & 1);
        auVar125._16_4_ = (uint)bVar70 * auVar112._16_4_ | (uint)!bVar70 * (int)fVar209;
        bVar70 = (bool)(bVar67 >> 5 & 1);
        auVar125._20_4_ = (uint)bVar70 * auVar112._20_4_ | (uint)!bVar70 * (int)fVar210;
        bVar70 = (bool)(bVar67 >> 6 & 1);
        auVar125._24_4_ = (uint)bVar70 * auVar112._24_4_ | (uint)!bVar70 * (int)fVar211;
        auVar125._28_4_ =
             (uint)(bVar67 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar115._28_4_;
        auVar115 = vminps_avx512vl(auVar109,auVar125);
        auVar74 = vxorps_avx512vl(auVar109._0_16_,auVar109._0_16_);
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar74),auVar103);
        auVar104 = vsubps_avx512vl(ZEXT1632(auVar74),auVar104);
        auVar109 = ZEXT1632(auVar74);
        auVar105 = vsubps_avx512vl(auVar109,auVar105);
        auVar105 = vmulps_avx512vl(auVar105,auVar102);
        auVar104 = vfmadd231ps_avx512vl(auVar105,auVar108,auVar104);
        auVar103 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar103);
        auVar102 = vmulps_avx512vl(local_480,auVar102);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_380,auVar108);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_460,auVar107);
        vandps_avx512vl(auVar102,auVar113);
        uVar15 = vcmpps_avx512vl(auVar102,auVar114,1);
        auVar103 = vxorps_avx512vl(auVar103,auVar82);
        auVar104 = vrcp14ps_avx512vl(auVar102);
        auVar82 = vxorps_avx512vl(auVar102,auVar82);
        auVar240 = ZEXT3264(auVar82);
        auVar105 = vfnmadd213ps_avx512vl(auVar104,auVar102,auVar98);
        auVar74 = vfmadd132ps_fma(auVar105,auVar104,auVar104);
        fVar229 = auVar74._0_4_ * auVar103._0_4_;
        fVar232 = auVar74._4_4_ * auVar103._4_4_;
        auVar45._4_4_ = fVar232;
        auVar45._0_4_ = fVar229;
        fVar233 = auVar74._8_4_ * auVar103._8_4_;
        auVar45._8_4_ = fVar233;
        fVar234 = auVar74._12_4_ * auVar103._12_4_;
        auVar45._12_4_ = fVar234;
        fVar209 = auVar103._16_4_ * 0.0;
        auVar45._16_4_ = fVar209;
        fVar210 = auVar103._20_4_ * 0.0;
        auVar45._20_4_ = fVar210;
        fVar211 = auVar103._24_4_ * 0.0;
        auVar45._24_4_ = fVar211;
        auVar45._28_4_ = auVar103._28_4_;
        uVar18 = vcmpps_avx512vl(auVar102,auVar82,1);
        bVar67 = (byte)uVar15 | (byte)uVar18;
        auVar105 = vblendmps_avx512vl(auVar45,auVar248);
        auVar126._0_4_ =
             (uint)(bVar67 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar104._0_4_;
        bVar70 = (bool)(bVar67 >> 1 & 1);
        auVar126._4_4_ = (uint)bVar70 * auVar105._4_4_ | (uint)!bVar70 * auVar104._4_4_;
        bVar70 = (bool)(bVar67 >> 2 & 1);
        auVar126._8_4_ = (uint)bVar70 * auVar105._8_4_ | (uint)!bVar70 * auVar104._8_4_;
        bVar70 = (bool)(bVar67 >> 3 & 1);
        auVar126._12_4_ = (uint)bVar70 * auVar105._12_4_ | (uint)!bVar70 * auVar104._12_4_;
        bVar70 = (bool)(bVar67 >> 4 & 1);
        auVar126._16_4_ = (uint)bVar70 * auVar105._16_4_ | (uint)!bVar70 * auVar104._16_4_;
        bVar70 = (bool)(bVar67 >> 5 & 1);
        auVar126._20_4_ = (uint)bVar70 * auVar105._20_4_ | (uint)!bVar70 * auVar104._20_4_;
        bVar70 = (bool)(bVar67 >> 6 & 1);
        auVar126._24_4_ = (uint)bVar70 * auVar105._24_4_ | (uint)!bVar70 * auVar104._24_4_;
        auVar126._28_4_ =
             (uint)(bVar67 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar104._28_4_;
        local_440 = vmaxps_avx(auVar111,auVar126);
        uVar18 = vcmpps_avx512vl(auVar102,auVar82,6);
        bVar67 = (byte)uVar15 | (byte)uVar18;
        auVar127._0_4_ =
             (uint)(bVar67 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar67 & 1) * (int)fVar229;
        bVar70 = (bool)(bVar67 >> 1 & 1);
        auVar127._4_4_ = (uint)bVar70 * auVar112._4_4_ | (uint)!bVar70 * (int)fVar232;
        bVar70 = (bool)(bVar67 >> 2 & 1);
        auVar127._8_4_ = (uint)bVar70 * auVar112._8_4_ | (uint)!bVar70 * (int)fVar233;
        bVar70 = (bool)(bVar67 >> 3 & 1);
        auVar127._12_4_ = (uint)bVar70 * auVar112._12_4_ | (uint)!bVar70 * (int)fVar234;
        bVar70 = (bool)(bVar67 >> 4 & 1);
        auVar127._16_4_ = (uint)bVar70 * auVar112._16_4_ | (uint)!bVar70 * (int)fVar209;
        bVar70 = (bool)(bVar67 >> 5 & 1);
        auVar127._20_4_ = (uint)bVar70 * auVar112._20_4_ | (uint)!bVar70 * (int)fVar210;
        bVar70 = (bool)(bVar67 >> 6 & 1);
        auVar127._24_4_ = (uint)bVar70 * auVar112._24_4_ | (uint)!bVar70 * (int)fVar211;
        auVar127._28_4_ =
             (uint)(bVar67 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar103._28_4_;
        local_340 = vminps_avx(auVar115,auVar127);
        auVar235 = ZEXT3264(local_340);
        uVar15 = vcmpps_avx512vl(local_440,local_340,2);
        bVar63 = bVar63 & 0x7f & (byte)uVar15;
        if (bVar63 == 0) goto LAB_01a9978e;
        auVar82 = vmaxps_avx512vl(auVar109,auVar84);
        auVar84 = vfmadd213ps_avx512vl(local_580,auVar118,auVar110);
        fVar229 = auVar106._0_4_;
        fVar232 = auVar106._4_4_;
        auVar46._4_4_ = fVar232 * auVar84._4_4_;
        auVar46._0_4_ = fVar229 * auVar84._0_4_;
        fVar233 = auVar106._8_4_;
        auVar46._8_4_ = fVar233 * auVar84._8_4_;
        fVar234 = auVar106._12_4_;
        auVar46._12_4_ = fVar234 * auVar84._12_4_;
        fVar209 = auVar106._16_4_;
        auVar46._16_4_ = fVar209 * auVar84._16_4_;
        fVar210 = auVar106._20_4_;
        auVar46._20_4_ = fVar210 * auVar84._20_4_;
        fVar211 = auVar106._24_4_;
        auVar46._24_4_ = fVar211 * auVar84._24_4_;
        auVar46._28_4_ = auVar84._28_4_;
        auVar84 = vfmadd213ps_avx512vl(local_5c0,auVar118,auVar110);
        auVar47._4_4_ = fVar232 * auVar84._4_4_;
        auVar47._0_4_ = fVar229 * auVar84._0_4_;
        auVar47._8_4_ = fVar233 * auVar84._8_4_;
        auVar47._12_4_ = fVar234 * auVar84._12_4_;
        auVar47._16_4_ = fVar209 * auVar84._16_4_;
        auVar47._20_4_ = fVar210 * auVar84._20_4_;
        auVar47._24_4_ = fVar211 * auVar84._24_4_;
        auVar47._28_4_ = auVar84._28_4_;
        auVar84 = vminps_avx512vl(auVar46,auVar98);
        auVar54 = ZEXT812(0);
        auVar102 = ZEXT1232(auVar54) << 0x20;
        auVar84 = vmaxps_avx(auVar84,ZEXT1232(auVar54) << 0x20);
        auVar103 = vminps_avx512vl(auVar47,auVar98);
        auVar48._4_4_ = (auVar84._4_4_ + 1.0) * 0.125;
        auVar48._0_4_ = (auVar84._0_4_ + 0.0) * 0.125;
        auVar48._8_4_ = (auVar84._8_4_ + 2.0) * 0.125;
        auVar48._12_4_ = (auVar84._12_4_ + 3.0) * 0.125;
        auVar48._16_4_ = (auVar84._16_4_ + 4.0) * 0.125;
        auVar48._20_4_ = (auVar84._20_4_ + 5.0) * 0.125;
        auVar48._24_4_ = (auVar84._24_4_ + 6.0) * 0.125;
        auVar48._28_4_ = auVar84._28_4_ + 7.0;
        local_1a0 = vfmadd213ps_avx512vl(auVar48,local_720,local_780);
        auVar84 = vmaxps_avx(auVar103,ZEXT1232(auVar54) << 0x20);
        auVar49._4_4_ = (auVar84._4_4_ + 1.0) * 0.125;
        auVar49._0_4_ = (auVar84._0_4_ + 0.0) * 0.125;
        auVar49._8_4_ = (auVar84._8_4_ + 2.0) * 0.125;
        auVar49._12_4_ = (auVar84._12_4_ + 3.0) * 0.125;
        auVar49._16_4_ = (auVar84._16_4_ + 4.0) * 0.125;
        auVar49._20_4_ = (auVar84._20_4_ + 5.0) * 0.125;
        auVar49._24_4_ = (auVar84._24_4_ + 6.0) * 0.125;
        auVar49._28_4_ = auVar84._28_4_ + 7.0;
        local_1c0 = vfmadd213ps_avx512vl(auVar49,local_720,local_780);
        auVar50._4_4_ = auVar82._4_4_ * auVar82._4_4_;
        auVar50._0_4_ = auVar82._0_4_ * auVar82._0_4_;
        auVar50._8_4_ = auVar82._8_4_ * auVar82._8_4_;
        auVar50._12_4_ = auVar82._12_4_ * auVar82._12_4_;
        auVar50._16_4_ = auVar82._16_4_ * auVar82._16_4_;
        auVar50._20_4_ = auVar82._20_4_ * auVar82._20_4_;
        auVar50._24_4_ = auVar82._24_4_ * auVar82._24_4_;
        auVar50._28_4_ = auVar82._28_4_;
        auVar84 = vsubps_avx(local_740,auVar50);
        auVar51._4_4_ = auVar84._4_4_ * (float)local_7c0._4_4_;
        auVar51._0_4_ = auVar84._0_4_ * (float)local_7c0._0_4_;
        auVar51._8_4_ = auVar84._8_4_ * fStack_7b8;
        auVar51._12_4_ = auVar84._12_4_ * fStack_7b4;
        auVar51._16_4_ = auVar84._16_4_ * fStack_7b0;
        auVar51._20_4_ = auVar84._20_4_ * fStack_7ac;
        auVar51._24_4_ = auVar84._24_4_ * fStack_7a8;
        auVar51._28_4_ = auVar82._28_4_;
        auVar82 = vsubps_avx(local_7a0,auVar51);
        uVar15 = vcmpps_avx512vl(auVar82,ZEXT1232(auVar54) << 0x20,5);
        bVar67 = (byte)uVar15;
        auVar250 = ZEXT3264(local_840);
        if (bVar67 == 0) {
          bVar67 = 0;
          auVar83 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar228 = ZEXT864(0) << 0x20;
          auVar82 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar98 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar238 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar128._8_4_ = 0x7f800000;
          auVar128._0_8_ = 0x7f8000007f800000;
          auVar128._12_4_ = 0x7f800000;
          auVar128._16_4_ = 0x7f800000;
          auVar128._20_4_ = 0x7f800000;
          auVar128._24_4_ = 0x7f800000;
          auVar128._28_4_ = 0x7f800000;
          auVar129._8_4_ = 0xff800000;
          auVar129._0_8_ = 0xff800000ff800000;
          auVar129._12_4_ = 0xff800000;
          auVar129._16_4_ = 0xff800000;
          auVar129._20_4_ = 0xff800000;
          auVar129._24_4_ = 0xff800000;
          auVar129._28_4_ = 0xff800000;
        }
        else {
          auVar75 = vxorps_avx512vl(auVar113._0_16_,auVar113._0_16_);
          uVar69 = vcmpps_avx512vl(auVar82,auVar109,5);
          auVar82 = vsqrtps_avx(auVar82);
          auVar98 = vfnmadd213ps_avx512vl(auVar117,local_7e0,auVar98);
          auVar102 = vfmadd132ps_avx512vl(auVar98,local_7e0,local_7e0);
          auVar98 = vsubps_avx(_local_5a0,auVar82);
          auVar104 = vmulps_avx512vl(auVar98,auVar102);
          auVar82 = vsubps_avx512vl(auVar82,auVar119);
          auVar105 = vmulps_avx512vl(auVar82,auVar102);
          auVar82 = vfmadd213ps_avx512vl(auVar118,auVar104,auVar110);
          auVar52._4_4_ = fVar232 * auVar82._4_4_;
          auVar52._0_4_ = fVar229 * auVar82._0_4_;
          auVar52._8_4_ = fVar233 * auVar82._8_4_;
          auVar52._12_4_ = fVar234 * auVar82._12_4_;
          auVar52._16_4_ = fVar209 * auVar82._16_4_;
          auVar52._20_4_ = fVar210 * auVar82._20_4_;
          auVar52._24_4_ = fVar211 * auVar82._24_4_;
          auVar52._28_4_ = auVar103._28_4_;
          auVar82 = vmulps_avx512vl(local_460,auVar104);
          auVar98 = vmulps_avx512vl(local_380,auVar104);
          auVar102 = vmulps_avx512vl(local_480,auVar104);
          auVar103 = vfmadd213ps_avx512vl(auVar83,auVar52,auVar99);
          auVar82 = vsubps_avx512vl(auVar82,auVar103);
          auVar103 = vfmadd213ps_avx512vl(auVar96,auVar52,auVar100);
          auVar98 = vsubps_avx512vl(auVar98,auVar103);
          auVar74 = vfmadd213ps_fma(auVar52,auVar97,auVar101);
          auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar74));
          auVar238 = auVar102._0_28_;
          auVar102 = vfmadd213ps_avx512vl(auVar118,auVar105,auVar110);
          auVar103 = vmulps_avx512vl(auVar106,auVar102);
          auVar102 = vmulps_avx512vl(local_460,auVar105);
          auVar106 = vmulps_avx512vl(local_380,auVar105);
          auVar107 = vmulps_avx512vl(local_480,auVar105);
          auVar74 = vfmadd213ps_fma(auVar83,auVar103,auVar99);
          auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar74));
          auVar74 = vfmadd213ps_fma(auVar96,auVar103,auVar100);
          auVar83 = vsubps_avx512vl(auVar106,ZEXT1632(auVar74));
          auVar74 = vfmadd213ps_fma(auVar97,auVar103,auVar101);
          auVar96 = vsubps_avx512vl(auVar107,ZEXT1632(auVar74));
          auVar228 = ZEXT3264(auVar96);
          auVar148._8_4_ = 0x7f800000;
          auVar148._0_8_ = 0x7f8000007f800000;
          auVar148._12_4_ = 0x7f800000;
          auVar148._16_4_ = 0x7f800000;
          auVar148._20_4_ = 0x7f800000;
          auVar148._24_4_ = 0x7f800000;
          auVar148._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar148,auVar104);
          bVar70 = (bool)((byte)uVar69 & 1);
          auVar128._0_4_ = (uint)bVar70 * auVar96._0_4_ | (uint)!bVar70 * auVar99._0_4_;
          bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar70 * auVar96._4_4_ | (uint)!bVar70 * auVar99._4_4_;
          bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar70 * auVar96._8_4_ | (uint)!bVar70 * auVar99._8_4_;
          bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar70 * auVar96._12_4_ | (uint)!bVar70 * auVar99._12_4_;
          bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar128._16_4_ = (uint)bVar70 * auVar96._16_4_ | (uint)!bVar70 * auVar99._16_4_;
          bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar128._20_4_ = (uint)bVar70 * auVar96._20_4_ | (uint)!bVar70 * auVar99._20_4_;
          bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar128._24_4_ = (uint)bVar70 * auVar96._24_4_ | (uint)!bVar70 * auVar99._24_4_;
          bVar70 = SUB81(uVar69 >> 7,0);
          auVar128._28_4_ = (uint)bVar70 * auVar96._28_4_ | (uint)!bVar70 * auVar99._28_4_;
          auVar149._8_4_ = 0xff800000;
          auVar149._0_8_ = 0xff800000ff800000;
          auVar149._12_4_ = 0xff800000;
          auVar149._16_4_ = 0xff800000;
          auVar149._20_4_ = 0xff800000;
          auVar149._24_4_ = 0xff800000;
          auVar149._28_4_ = 0xff800000;
          auVar96 = vblendmps_avx512vl(auVar149,auVar105);
          bVar70 = (bool)((byte)uVar69 & 1);
          auVar129._0_4_ = (uint)bVar70 * auVar96._0_4_ | (uint)!bVar70 * -0x800000;
          bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar70 * auVar96._4_4_ | (uint)!bVar70 * -0x800000;
          bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar70 * auVar96._8_4_ | (uint)!bVar70 * -0x800000;
          bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar70 * auVar96._12_4_ | (uint)!bVar70 * -0x800000;
          bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar129._16_4_ = (uint)bVar70 * auVar96._16_4_ | (uint)!bVar70 * -0x800000;
          bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar129._20_4_ = (uint)bVar70 * auVar96._20_4_ | (uint)!bVar70 * -0x800000;
          bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar129._24_4_ = (uint)bVar70 * auVar96._24_4_ | (uint)!bVar70 * -0x800000;
          bVar70 = SUB81(uVar69 >> 7,0);
          auVar129._28_4_ = (uint)bVar70 * auVar96._28_4_ | (uint)!bVar70 * -0x800000;
          auVar27._8_4_ = 0x36000000;
          auVar27._0_8_ = 0x3600000036000000;
          auVar27._12_4_ = 0x36000000;
          auVar27._16_4_ = 0x36000000;
          auVar27._20_4_ = 0x36000000;
          auVar27._24_4_ = 0x36000000;
          auVar27._28_4_ = 0x36000000;
          auVar96 = vmulps_avx512vl(local_5e0,auVar27);
          uVar16 = vcmpps_avx512vl(auVar96,local_600,0xe);
          uVar69 = uVar69 & uVar16;
          bVar65 = (byte)uVar69;
          if (bVar65 != 0) {
            uVar16 = vcmpps_avx512vl(auVar84,ZEXT1632(auVar75),2);
            auVar230._8_4_ = 0x7f800000;
            auVar230._0_8_ = 0x7f8000007f800000;
            auVar230._12_4_ = 0x7f800000;
            auVar230._16_4_ = 0x7f800000;
            auVar230._20_4_ = 0x7f800000;
            auVar230._24_4_ = 0x7f800000;
            auVar230._28_4_ = 0x7f800000;
            auVar244._8_4_ = 0xff800000;
            auVar244._0_8_ = 0xff800000ff800000;
            auVar244._12_4_ = 0xff800000;
            auVar244._16_4_ = 0xff800000;
            auVar244._20_4_ = 0xff800000;
            auVar244._24_4_ = 0xff800000;
            auVar244._28_4_ = 0xff800000;
            auVar84 = vblendmps_avx512vl(auVar230,auVar244);
            bVar64 = (byte)uVar16;
            uVar71 = (uint)(bVar64 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar96._0_4_;
            bVar70 = (bool)((byte)(uVar16 >> 1) & 1);
            uVar133 = (uint)bVar70 * auVar84._4_4_ | (uint)!bVar70 * auVar96._4_4_;
            bVar70 = (bool)((byte)(uVar16 >> 2) & 1);
            uVar134 = (uint)bVar70 * auVar84._8_4_ | (uint)!bVar70 * auVar96._8_4_;
            bVar70 = (bool)((byte)(uVar16 >> 3) & 1);
            uVar135 = (uint)bVar70 * auVar84._12_4_ | (uint)!bVar70 * auVar96._12_4_;
            bVar70 = (bool)((byte)(uVar16 >> 4) & 1);
            uVar136 = (uint)bVar70 * auVar84._16_4_ | (uint)!bVar70 * auVar96._16_4_;
            bVar70 = (bool)((byte)(uVar16 >> 5) & 1);
            uVar137 = (uint)bVar70 * auVar84._20_4_ | (uint)!bVar70 * auVar96._20_4_;
            bVar70 = (bool)((byte)(uVar16 >> 6) & 1);
            uVar138 = (uint)bVar70 * auVar84._24_4_ | (uint)!bVar70 * auVar96._24_4_;
            bVar70 = SUB81(uVar16 >> 7,0);
            uVar139 = (uint)bVar70 * auVar84._28_4_ | (uint)!bVar70 * auVar96._28_4_;
            auVar128._0_4_ = (bVar65 & 1) * uVar71 | !(bool)(bVar65 & 1) * auVar128._0_4_;
            bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar128._4_4_ = bVar70 * uVar133 | !bVar70 * auVar128._4_4_;
            bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar128._8_4_ = bVar70 * uVar134 | !bVar70 * auVar128._8_4_;
            bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar128._12_4_ = bVar70 * uVar135 | !bVar70 * auVar128._12_4_;
            bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar128._16_4_ = bVar70 * uVar136 | !bVar70 * auVar128._16_4_;
            bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar128._20_4_ = bVar70 * uVar137 | !bVar70 * auVar128._20_4_;
            bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar128._24_4_ = bVar70 * uVar138 | !bVar70 * auVar128._24_4_;
            bVar70 = SUB81(uVar69 >> 7,0);
            auVar128._28_4_ = bVar70 * uVar139 | !bVar70 * auVar128._28_4_;
            auVar84 = vblendmps_avx512vl(auVar244,auVar230);
            bVar70 = (bool)((byte)(uVar16 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar16 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar16 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar16 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar16 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar16 >> 6) & 1);
            bVar13 = SUB81(uVar16 >> 7,0);
            auVar129._0_4_ =
                 (uint)(bVar65 & 1) *
                 ((uint)(bVar64 & 1) * auVar84._0_4_ | !(bool)(bVar64 & 1) * uVar71) |
                 !(bool)(bVar65 & 1) * auVar129._0_4_;
            bVar7 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar129._4_4_ =
                 (uint)bVar7 * ((uint)bVar70 * auVar84._4_4_ | !bVar70 * uVar133) |
                 !bVar7 * auVar129._4_4_;
            bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar129._8_4_ =
                 (uint)bVar70 * ((uint)bVar8 * auVar84._8_4_ | !bVar8 * uVar134) |
                 !bVar70 * auVar129._8_4_;
            bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar129._12_4_ =
                 (uint)bVar70 * ((uint)bVar9 * auVar84._12_4_ | !bVar9 * uVar135) |
                 !bVar70 * auVar129._12_4_;
            bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar129._16_4_ =
                 (uint)bVar70 * ((uint)bVar10 * auVar84._16_4_ | !bVar10 * uVar136) |
                 !bVar70 * auVar129._16_4_;
            bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar129._20_4_ =
                 (uint)bVar70 * ((uint)bVar11 * auVar84._20_4_ | !bVar11 * uVar137) |
                 !bVar70 * auVar129._20_4_;
            bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar129._24_4_ =
                 (uint)bVar70 * ((uint)bVar12 * auVar84._24_4_ | !bVar12 * uVar138) |
                 !bVar70 * auVar129._24_4_;
            bVar70 = SUB81(uVar69 >> 7,0);
            auVar129._28_4_ =
                 (uint)bVar70 * ((uint)bVar13 * auVar84._28_4_ | !bVar13 * uVar139) |
                 !bVar70 * auVar129._28_4_;
            bVar67 = (~bVar65 | bVar64) & bVar67;
          }
        }
        auVar245 = ZEXT3264(local_480);
        auVar231._0_4_ = local_480._0_4_ * auVar228._0_4_;
        auVar231._4_4_ = local_480._4_4_ * auVar228._4_4_;
        auVar231._8_4_ = local_480._8_4_ * auVar228._8_4_;
        auVar231._12_4_ = local_480._12_4_ * auVar228._12_4_;
        auVar231._16_4_ = local_480._16_4_ * auVar228._16_4_;
        auVar231._20_4_ = local_480._20_4_ * auVar228._20_4_;
        auVar231._28_36_ = auVar228._28_36_;
        auVar231._24_4_ = local_480._24_4_ * auVar228._24_4_;
        auVar84 = vfmadd231ps_avx512vl(auVar231._0_32_,local_380,auVar83);
        auVar231 = ZEXT3264(local_380);
        auVar84 = vfmadd231ps_avx512vl(auVar84,local_460,auVar102);
        auVar240 = ZEXT3264(local_440);
        _local_200 = local_440;
        local_1e0 = vminps_avx(local_340,auVar128);
        auVar226._8_4_ = 0x7fffffff;
        auVar226._0_8_ = 0x7fffffff7fffffff;
        auVar226._12_4_ = 0x7fffffff;
        auVar226._16_4_ = 0x7fffffff;
        auVar226._20_4_ = 0x7fffffff;
        auVar226._24_4_ = 0x7fffffff;
        auVar226._28_4_ = 0x7fffffff;
        auVar84 = vandps_avx(auVar84,auVar226);
        _local_360 = vmaxps_avx(local_440,auVar129);
        auVar227._8_4_ = 0x3e99999a;
        auVar227._0_8_ = 0x3e99999a3e99999a;
        auVar227._12_4_ = 0x3e99999a;
        auVar227._16_4_ = 0x3e99999a;
        auVar227._20_4_ = 0x3e99999a;
        auVar227._24_4_ = 0x3e99999a;
        auVar227._28_4_ = 0x3e99999a;
        auVar228 = ZEXT3264(auVar227);
        uVar15 = vcmpps_avx512vl(auVar84,auVar227,1);
        uVar18 = vcmpps_avx512vl(local_440,local_1e0,2);
        bVar65 = (byte)uVar18 & bVar63;
        uVar17 = vcmpps_avx512vl(_local_360,local_340,2);
        if ((bVar63 & ((byte)uVar17 | (byte)uVar18)) == 0) {
          auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar251 = ZEXT3264(auVar84);
          auVar222 = ZEXT3264(_DAT_01f7b040);
        }
        else {
          _local_400 = _local_360;
          local_850 = (uint)(byte)((byte)uVar15 | ~bVar67);
          auVar53._4_4_ = local_480._4_4_ * auVar238._4_4_;
          auVar53._0_4_ = local_480._0_4_ * auVar238._0_4_;
          auVar53._8_4_ = local_480._8_4_ * auVar238._8_4_;
          auVar53._12_4_ = local_480._12_4_ * auVar238._12_4_;
          auVar53._16_4_ = local_480._16_4_ * auVar238._16_4_;
          auVar53._20_4_ = local_480._20_4_ * auVar238._20_4_;
          auVar53._24_4_ = local_480._24_4_ * auVar238._24_4_;
          auVar53._28_4_ = local_360._28_4_;
          auVar74 = vfmadd213ps_fma(auVar98,local_380,auVar53);
          auVar84 = vfmadd213ps_avx512vl(auVar82,local_460,ZEXT1632(auVar74));
          auVar84 = vandps_avx(auVar84,auVar226);
          uVar15 = vcmpps_avx512vl(auVar84,auVar227,1);
          bVar67 = (byte)uVar15 | ~bVar67;
          auVar150._8_4_ = 2;
          auVar150._0_8_ = 0x200000002;
          auVar150._12_4_ = 2;
          auVar150._16_4_ = 2;
          auVar150._20_4_ = 2;
          auVar150._24_4_ = 2;
          auVar150._28_4_ = 2;
          auVar28._8_4_ = 3;
          auVar28._0_8_ = 0x300000003;
          auVar28._12_4_ = 3;
          auVar28._16_4_ = 3;
          auVar28._20_4_ = 3;
          auVar28._24_4_ = 3;
          auVar28._28_4_ = 3;
          auVar84 = vpblendmd_avx512vl(auVar150,auVar28);
          local_320._0_4_ = (uint)(bVar67 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar67 & 1) * 2;
          bVar70 = (bool)(bVar67 >> 1 & 1);
          local_320._4_4_ = (uint)bVar70 * auVar84._4_4_ | (uint)!bVar70 * 2;
          bVar70 = (bool)(bVar67 >> 2 & 1);
          local_320._8_4_ = (uint)bVar70 * auVar84._8_4_ | (uint)!bVar70 * 2;
          bVar70 = (bool)(bVar67 >> 3 & 1);
          local_320._12_4_ = (uint)bVar70 * auVar84._12_4_ | (uint)!bVar70 * 2;
          bVar70 = (bool)(bVar67 >> 4 & 1);
          local_320._16_4_ = (uint)bVar70 * auVar84._16_4_ | (uint)!bVar70 * 2;
          bVar70 = (bool)(bVar67 >> 5 & 1);
          local_320._20_4_ = (uint)bVar70 * auVar84._20_4_ | (uint)!bVar70 * 2;
          bVar70 = (bool)(bVar67 >> 6 & 1);
          local_320._24_4_ = (uint)bVar70 * auVar84._24_4_ | (uint)!bVar70 * 2;
          local_320._28_4_ = (uint)(bVar67 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar67 >> 7) * 2;
          local_3a0 = vpbroadcastd_avx512vl();
          uVar15 = vpcmpd_avx512vl(local_3a0,local_320,5);
          local_84c = (uint)bVar65;
          local_3e0 = local_440._0_4_ + (float)local_420._0_4_;
          fStack_3dc = local_440._4_4_ + (float)local_420._4_4_;
          fStack_3d8 = local_440._8_4_ + fStack_418;
          fStack_3d4 = local_440._12_4_ + fStack_414;
          fStack_3d0 = local_440._16_4_ + fStack_410;
          fStack_3cc = local_440._20_4_ + fStack_40c;
          fStack_3c8 = local_440._24_4_ + fStack_408;
          fStack_3c4 = local_440._28_4_ + fStack_404;
          for (bVar65 = (byte)uVar15 & bVar65; auVar84 = local_780, bVar65 != 0;
              bVar65 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar65 & (byte)uVar15) {
            auVar151._8_4_ = 0x7f800000;
            auVar151._0_8_ = 0x7f8000007f800000;
            auVar151._12_4_ = 0x7f800000;
            auVar151._16_4_ = 0x7f800000;
            auVar151._20_4_ = 0x7f800000;
            auVar151._24_4_ = 0x7f800000;
            auVar151._28_4_ = 0x7f800000;
            auVar82 = vblendmps_avx512vl(auVar151,local_440);
            auVar130._0_4_ =
                 (uint)(bVar65 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar65 & 1) * 0x7f800000;
            bVar70 = (bool)(bVar65 >> 1 & 1);
            auVar130._4_4_ = (uint)bVar70 * auVar82._4_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar65 >> 2 & 1);
            auVar130._8_4_ = (uint)bVar70 * auVar82._8_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar65 >> 3 & 1);
            auVar130._12_4_ = (uint)bVar70 * auVar82._12_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar65 >> 4 & 1);
            auVar130._16_4_ = (uint)bVar70 * auVar82._16_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar65 >> 5 & 1);
            auVar130._20_4_ = (uint)bVar70 * auVar82._20_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar65 >> 6 & 1);
            auVar130._24_4_ = (uint)bVar70 * auVar82._24_4_ | (uint)!bVar70 * 0x7f800000;
            auVar130._28_4_ =
                 (uint)(bVar65 >> 7) * auVar82._28_4_ | (uint)!(bool)(bVar65 >> 7) * 0x7f800000;
            auVar82 = vshufps_avx(auVar130,auVar130,0xb1);
            auVar82 = vminps_avx(auVar130,auVar82);
            auVar83 = vshufpd_avx(auVar82,auVar82,5);
            auVar82 = vminps_avx(auVar82,auVar83);
            auVar83 = vpermpd_avx2(auVar82,0x4e);
            auVar82 = vminps_avx(auVar82,auVar83);
            uVar15 = vcmpps_avx512vl(auVar130,auVar82,0);
            bVar64 = (byte)uVar15 & bVar65;
            bVar67 = bVar65;
            if (bVar64 != 0) {
              bVar67 = bVar64;
            }
            iVar19 = 0;
            for (uVar71 = (uint)bVar67; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            uVar71 = *(uint *)(local_1a0 + (uint)(iVar19 << 2));
            auVar231 = ZEXT464(*(uint *)(local_200 + (uint)(iVar19 << 2)));
            fVar229 = local_848;
            if ((float)local_700._0_4_ < 0.0) {
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar19 << 2)));
              local_780[1] = 0;
              local_780[0] = bVar65;
              local_780._2_30_ = auVar84._2_30_;
              auVar228 = ZEXT1664(auVar228._0_16_);
              auVar235 = ZEXT1664(auVar235._0_16_);
              auVar240 = ZEXT1664(auVar240._0_16_);
              auVar245 = ZEXT1664(auVar245._0_16_);
              fVar229 = sqrtf((float)local_700._0_4_);
              bVar65 = local_780[0];
              auVar231 = ZEXT1664(local_7a0._0_16_);
              auVar250 = ZEXT3264(local_840);
            }
            auVar222 = ZEXT464(uVar71);
            auVar75 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar74 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar76 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar77 = vminps_avx(auVar75,auVar76);
            auVar75 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar76 = vmaxps_avx(auVar74,auVar75);
            auVar202._8_4_ = 0x7fffffff;
            auVar202._0_8_ = 0x7fffffff7fffffff;
            auVar202._12_4_ = 0x7fffffff;
            auVar74 = vandps_avx(auVar77,auVar202);
            auVar75 = vandps_avx(auVar76,auVar202);
            auVar74 = vmaxps_avx(auVar74,auVar75);
            auVar75 = vmovshdup_avx(auVar74);
            auVar75 = vmaxss_avx(auVar75,auVar74);
            auVar74 = vshufpd_avx(auVar74,auVar74,1);
            auVar74 = vmaxss_avx(auVar74,auVar75);
            fVar232 = auVar74._0_4_ * 1.9073486e-06;
            local_640 = vshufps_avx(auVar76,auVar76,0xff);
            lVar66 = 5;
            do {
              do {
                auVar74 = auVar222._0_16_;
                bVar70 = lVar66 == 0;
                lVar66 = lVar66 + -1;
                if (bVar70) goto LAB_01a9a2fc;
                local_7a0._0_16_ = auVar231._0_16_;
                uVar162 = auVar231._0_4_;
                auVar142._4_4_ = uVar162;
                auVar142._0_4_ = uVar162;
                auVar142._8_4_ = uVar162;
                auVar142._12_4_ = uVar162;
                auVar75 = vfmadd132ps_fma(auVar142,ZEXT816(0) << 0x40,local_6f0);
                fVar237 = auVar222._0_4_;
                fVar218 = 1.0 - fVar237;
                fVar209 = fVar218 * fVar218 * fVar218;
                fVar233 = fVar237 * fVar237;
                fVar201 = fVar237 * fVar233;
                auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar209),
                                          ZEXT416((uint)fVar201));
                fVar234 = fVar237 * fVar218;
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * fVar234 * 6.0)),
                                          ZEXT416((uint)(fVar218 * fVar234)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar201),
                                          ZEXT416((uint)fVar209));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar234 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar237 * fVar234)));
                fVar209 = fVar209 * 0.16666667;
                fVar210 = (auVar76._0_4_ + auVar72._0_4_) * 0.16666667;
                fVar211 = (auVar77._0_4_ + auVar1._0_4_) * 0.16666667;
                fVar201 = fVar201 * 0.16666667;
                auVar180._0_4_ = fVar201 * (float)local_6e0._0_4_;
                auVar180._4_4_ = fVar201 * (float)local_6e0._4_4_;
                auVar180._8_4_ = fVar201 * fStack_6d8;
                auVar180._12_4_ = fVar201 * fStack_6d4;
                auVar212._4_4_ = fVar211;
                auVar212._0_4_ = fVar211;
                auVar212._8_4_ = fVar211;
                auVar212._12_4_ = fVar211;
                auVar76 = vfmadd132ps_fma(auVar212,auVar180,local_6a0._0_16_);
                auVar181._4_4_ = fVar210;
                auVar181._0_4_ = fVar210;
                auVar181._8_4_ = fVar210;
                auVar181._12_4_ = fVar210;
                auVar76 = vfmadd132ps_fma(auVar181,auVar76,local_6c0._0_16_);
                auVar163._4_4_ = fVar209;
                auVar163._0_4_ = fVar209;
                auVar163._8_4_ = fVar209;
                auVar163._12_4_ = fVar209;
                auVar76 = vfmadd132ps_fma(auVar163,auVar76,local_680._0_16_);
                local_580._0_16_ = auVar76;
                auVar76 = vsubps_avx(auVar75,auVar76);
                auVar75 = vdpps_avx(auVar76,auVar76,0x7f);
                local_720._0_16_ = auVar76;
                local_740._0_16_ = auVar75;
                local_780._0_16_ = ZEXT416((uint)fVar218);
                if (auVar75._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar233;
                  local_7e0._0_4_ = fVar234;
                  auVar228._0_4_ = sqrtf(auVar75._0_4_);
                  auVar228._4_60_ = extraout_var;
                  auVar75 = auVar228._0_16_;
                  fVar234 = (float)local_7e0._0_4_;
                  auVar76 = local_780._0_16_;
                }
                else {
                  auVar75 = vsqrtss_avx(auVar75,auVar75);
                  local_7c0._0_4_ = fVar233;
                  auVar76 = ZEXT416((uint)fVar218);
                }
                local_5a0._4_4_ = auVar76._0_4_;
                local_5a0._0_4_ = local_5a0._4_4_;
                fStack_598 = (float)local_5a0._4_4_;
                fStack_594 = (float)local_5a0._4_4_;
                auVar77 = vfnmsub213ss_fma(auVar74,auVar74,ZEXT416((uint)(fVar234 * 4.0)));
                auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * 4.0)),auVar76,auVar76);
                fVar233 = (float)local_5a0._4_4_ * -(float)local_5a0._4_4_ * 0.5;
                fVar234 = auVar77._0_4_ * 0.5;
                fVar209 = auVar76._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar203._0_4_ = (float)local_7c0._0_4_ * (float)local_6e0._0_4_;
                auVar203._4_4_ = (float)local_7c0._0_4_ * (float)local_6e0._4_4_;
                auVar203._8_4_ = (float)local_7c0._0_4_ * fStack_6d8;
                auVar203._12_4_ = (float)local_7c0._0_4_ * fStack_6d4;
                auVar164._4_4_ = fVar209;
                auVar164._0_4_ = fVar209;
                auVar164._8_4_ = fVar209;
                auVar164._12_4_ = fVar209;
                auVar76 = vfmadd132ps_fma(auVar164,auVar203,local_6a0._0_16_);
                auVar182._4_4_ = fVar234;
                auVar182._0_4_ = fVar234;
                auVar182._8_4_ = fVar234;
                auVar182._12_4_ = fVar234;
                auVar76 = vfmadd132ps_fma(auVar182,auVar76,local_6c0._0_16_);
                auVar242._4_4_ = fVar233;
                auVar242._0_4_ = fVar233;
                auVar242._8_4_ = fVar233;
                auVar242._12_4_ = fVar233;
                _local_7c0 = vfmadd132ps_fma(auVar242,auVar76,local_680._0_16_);
                local_5c0._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
                auVar55._12_4_ = 0;
                auVar55._0_12_ = ZEXT812(0);
                fVar233 = local_5c0._0_4_;
                auVar76 = vrsqrt14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar233));
                fVar234 = auVar76._0_4_;
                local_5e0._0_16_ = vrcp14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar233));
                auVar76 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
                local_600._0_4_ = auVar76._0_4_;
                local_7e0._0_4_ = auVar75._0_4_;
                if (fVar233 < -fVar233) {
                  auVar235._0_4_ = sqrtf(fVar233);
                  auVar235._4_60_ = extraout_var_00;
                  auVar75 = ZEXT416((uint)local_7e0._0_4_);
                  auVar77 = auVar235._0_16_;
                  auVar76 = _local_7c0;
                }
                else {
                  auVar77 = vsqrtss_avx512f(local_5c0._0_16_,local_5c0._0_16_);
                  auVar76 = _local_7c0;
                }
                fVar233 = fVar234 * 1.5 + fVar233 * -0.5 * fVar234 * fVar234 * fVar234;
                auVar219._0_4_ = auVar76._0_4_ * fVar233;
                auVar219._4_4_ = auVar76._4_4_ * fVar233;
                auVar219._8_4_ = auVar76._8_4_ * fVar233;
                auVar219._12_4_ = auVar76._12_4_ * fVar233;
                auVar72 = vdpps_avx(local_720._0_16_,auVar219,0x7f);
                fVar210 = auVar75._0_4_;
                fVar234 = auVar72._0_4_;
                auVar143._0_4_ = fVar234 * fVar234;
                auVar143._4_4_ = auVar72._4_4_ * auVar72._4_4_;
                auVar143._8_4_ = auVar72._8_4_ * auVar72._8_4_;
                auVar143._12_4_ = auVar72._12_4_ * auVar72._12_4_;
                auVar1 = vsubps_avx(local_740._0_16_,auVar143);
                fVar209 = auVar1._0_4_;
                auVar165._4_12_ = ZEXT812(0) << 0x20;
                auVar165._0_4_ = fVar209;
                auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar165);
                auVar73 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                auVar79 = vmulss_avx512f(auVar1,ZEXT416(0xbf000000));
                if (fVar209 < 0.0) {
                  local_630 = fVar233;
                  fStack_62c = fVar233;
                  fStack_628 = fVar233;
                  fStack_624 = fVar233;
                  local_620 = auVar219;
                  local_610 = auVar78;
                  fVar209 = sqrtf(fVar209);
                  auVar79 = ZEXT416(auVar79._0_4_);
                  auVar73 = ZEXT416(auVar73._0_4_);
                  auVar77 = ZEXT416(auVar77._0_4_);
                  auVar75 = ZEXT416((uint)local_7e0._0_4_);
                  auVar219 = local_620;
                  auVar76 = _local_7c0;
                  auVar78 = local_610;
                  fVar233 = local_630;
                  fVar211 = fStack_62c;
                  fVar201 = fStack_628;
                  fVar218 = fStack_624;
                }
                else {
                  auVar1 = vsqrtss_avx(auVar1,auVar1);
                  fVar209 = auVar1._0_4_;
                  fVar211 = fVar233;
                  fVar201 = fVar233;
                  fVar218 = fVar233;
                }
                auVar245 = ZEXT1664(auVar76);
                auVar240 = ZEXT1664(local_740._0_16_);
                auVar235 = ZEXT1664(local_720._0_16_);
                auVar250 = ZEXT3264(local_840);
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,auVar74);
                auVar74 = vfmadd231ss_fma(local_780._0_16_,auVar74,SUB6416(ZEXT464(0xc0000000),0));
                auVar183._0_4_ = fVar237 * (float)local_6e0._0_4_;
                auVar183._4_4_ = fVar237 * (float)local_6e0._4_4_;
                auVar183._8_4_ = fVar237 * fStack_6d8;
                auVar183._12_4_ = fVar237 * fStack_6d4;
                auVar204._0_4_ = auVar74._0_4_;
                auVar204._4_4_ = auVar204._0_4_;
                auVar204._8_4_ = auVar204._0_4_;
                auVar204._12_4_ = auVar204._0_4_;
                auVar74 = vfmadd132ps_fma(auVar204,auVar183,local_6a0._0_16_);
                auVar166._0_4_ = auVar1._0_4_;
                auVar166._4_4_ = auVar166._0_4_;
                auVar166._8_4_ = auVar166._0_4_;
                auVar166._12_4_ = auVar166._0_4_;
                auVar74 = vfmadd132ps_fma(auVar166,auVar74,local_6c0._0_16_);
                auVar74 = vfmadd132ps_fma(_local_5a0,auVar74,local_680._0_16_);
                auVar167._0_4_ = auVar74._0_4_ * (float)local_5c0._0_4_;
                auVar167._4_4_ = auVar74._4_4_ * (float)local_5c0._0_4_;
                auVar167._8_4_ = auVar74._8_4_ * (float)local_5c0._0_4_;
                auVar167._12_4_ = auVar74._12_4_ * (float)local_5c0._0_4_;
                auVar74 = vdpps_avx(auVar76,auVar74,0x7f);
                fVar179 = auVar74._0_4_;
                auVar184._0_4_ = auVar76._0_4_ * fVar179;
                auVar184._4_4_ = auVar76._4_4_ * fVar179;
                auVar184._8_4_ = auVar76._8_4_ * fVar179;
                auVar184._12_4_ = auVar76._12_4_ * fVar179;
                auVar74 = vsubps_avx(auVar167,auVar184);
                fVar179 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
                auVar20._8_4_ = 0x80000000;
                auVar20._0_8_ = 0x8000000080000000;
                auVar20._12_4_ = 0x80000000;
                auVar80 = vxorps_avx512vl(auVar76,auVar20);
                auVar213._0_4_ = fVar233 * auVar74._0_4_ * fVar179;
                auVar213._4_4_ = fVar211 * auVar74._4_4_ * fVar179;
                auVar213._8_4_ = fVar201 * auVar74._8_4_ * fVar179;
                auVar213._12_4_ = fVar218 * auVar74._12_4_ * fVar179;
                auVar74 = vdpps_avx(auVar80,auVar219,0x7f);
                auVar1 = vmaxss_avx(ZEXT416((uint)fVar232),
                                    ZEXT416((uint)((float)local_7a0._0_4_ * fVar229 * 1.9073486e-06)
                                           ));
                auVar81 = vdivss_avx512f(ZEXT416((uint)fVar232),auVar77);
                auVar77 = vdpps_avx(local_720._0_16_,auVar213,0x7f);
                auVar75 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar232),auVar1);
                auVar81 = vfmadd213ss_fma(ZEXT416((uint)(fVar210 + 1.0)),auVar81,auVar75);
                auVar75 = vdpps_avx(local_6f0,auVar219,0x7f);
                fVar233 = auVar74._0_4_ + auVar77._0_4_;
                auVar74 = vdpps_avx(local_720._0_16_,auVar80,0x7f);
                auVar79 = vmulss_avx512f(auVar79,auVar78);
                auVar78 = vmulss_avx512f(auVar78,auVar78);
                auVar77 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
                auVar79 = vaddss_avx512f(auVar73,ZEXT416((uint)(auVar79._0_4_ * auVar78._0_4_)));
                auVar78 = vfnmadd231ss_fma(auVar74,auVar72,ZEXT416((uint)fVar233));
                auVar73 = vfnmadd231ss_fma(auVar77,auVar72,auVar75);
                auVar74 = vpermilps_avx(local_580._0_16_,0xff);
                fVar209 = fVar209 - auVar74._0_4_;
                auVar74 = vshufps_avx(auVar76,auVar76,0xff);
                auVar77 = vfmsub213ss_fma(auVar78,auVar79,auVar74);
                fVar210 = auVar73._0_4_ * auVar79._0_4_;
                auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar77._0_4_)),
                                          ZEXT416((uint)fVar233),ZEXT416((uint)fVar210));
                auVar228 = ZEXT1664(auVar78);
                fVar211 = auVar78._0_4_;
                fVar237 = fVar237 - (fVar234 * (fVar210 / fVar211) -
                                    fVar209 * (auVar75._0_4_ / fVar211));
                auVar222 = ZEXT464((uint)fVar237);
                fVar233 = (float)local_7a0._0_4_ -
                          (fVar209 * (fVar233 / fVar211) - fVar234 * (auVar77._0_4_ / fVar211));
                auVar231 = ZEXT464((uint)fVar233);
                auVar21._8_4_ = 0x7fffffff;
                auVar21._0_8_ = 0x7fffffff7fffffff;
                auVar21._12_4_ = 0x7fffffff;
                auVar75 = vandps_avx512vl(auVar72,auVar21);
              } while (auVar81._0_4_ <= auVar75._0_4_);
              auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ + auVar1._0_4_)),local_640,
                                        ZEXT416(0x36000000));
              auVar22._8_4_ = 0x7fffffff;
              auVar22._0_8_ = 0x7fffffff7fffffff;
              auVar22._12_4_ = 0x7fffffff;
              auVar77 = vandps_avx512vl(ZEXT416((uint)fVar209),auVar22);
            } while (auVar75._0_4_ <= auVar77._0_4_);
            fVar229 = fVar233 + (float)local_650._0_4_;
            if ((((fVar140 <= fVar229) &&
                 (fVar232 = *(float *)(ray + k * 4 + 0x80), fVar229 <= fVar232)) && (0.0 <= fVar237)
                ) && (fVar237 <= 1.0)) {
              auVar185._4_12_ = SUB1612(ZEXT816(0),0);
              auVar185._0_4_ = local_740._0_4_;
              auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar185);
              fVar234 = auVar75._0_4_;
              pGVar5 = (context->scene->geometries).items[uVar2].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar234 = fVar234 * 1.5 + local_740._0_4_ * -0.5 * fVar234 * fVar234 * fVar234;
                auVar186._0_4_ = local_720._0_4_ * fVar234;
                auVar186._4_4_ = local_720._4_4_ * fVar234;
                auVar186._8_4_ = local_720._8_4_ * fVar234;
                auVar186._12_4_ = local_720._12_4_ * fVar234;
                auVar72 = vfmadd213ps_fma(auVar74,auVar186,auVar76);
                auVar74 = vshufps_avx(auVar186,auVar186,0xc9);
                auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                auVar187._0_4_ = auVar186._0_4_ * auVar75._0_4_;
                auVar187._4_4_ = auVar186._4_4_ * auVar75._4_4_;
                auVar187._8_4_ = auVar186._8_4_ * auVar75._8_4_;
                auVar187._12_4_ = auVar186._12_4_ * auVar75._12_4_;
                auVar77 = vfmsub231ps_fma(auVar187,auVar76,auVar74);
                auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
                auVar75 = vshufps_avx(auVar72,auVar72,0xc9);
                auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                auVar144._0_4_ = auVar72._0_4_ * auVar77._0_4_;
                auVar144._4_4_ = auVar72._4_4_ * auVar77._4_4_;
                auVar144._8_4_ = auVar72._8_4_ * auVar77._8_4_;
                auVar144._12_4_ = auVar72._12_4_ * auVar77._12_4_;
                auVar74 = vfmsub231ps_fma(auVar144,auVar74,auVar75);
                uVar162 = auVar74._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar229;
                  uVar4 = vextractps_avx(auVar74,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                  uVar4 = vextractps_avx(auVar74,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar162;
                  *(float *)(ray + k * 4 + 0xf0) = fVar237;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = uVar3;
                  *(uint *)(ray + k * 4 + 0x120) = uVar2;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_520 = (RTCHitN  [16])vshufps_avx(auVar74,auVar74,0x55);
                  auStack_510 = vshufps_avx(auVar74,auVar74,0xaa);
                  local_500 = uVar162;
                  uStack_4fc = uVar162;
                  uStack_4f8 = uVar162;
                  uStack_4f4 = uVar162;
                  local_4f0 = fVar237;
                  fStack_4ec = fVar237;
                  fStack_4e8 = fVar237;
                  fStack_4e4 = fVar237;
                  local_4e0 = ZEXT416(0) << 0x20;
                  local_4d0 = local_540._0_8_;
                  uStack_4c8 = local_540._8_8_;
                  local_4c0 = local_530;
                  vpcmpeqd_avx2(ZEXT1632(local_530),ZEXT1632(local_530));
                  uStack_4ac = context->user->instID[0];
                  local_4b0 = uStack_4ac;
                  uStack_4a8 = uStack_4ac;
                  uStack_4a4 = uStack_4ac;
                  uStack_4a0 = context->user->instPrimID[0];
                  uStack_49c = uStack_4a0;
                  uStack_498 = uStack_4a0;
                  uStack_494 = uStack_4a0;
                  *(float *)(ray + k * 4 + 0x80) = fVar229;
                  local_860 = local_550;
                  local_810.valid = (int *)local_860;
                  local_810.geometryUserPtr = pGVar5->userPtr;
                  local_810.context = context->user;
                  local_810.hit = local_520;
                  local_810.N = 4;
                  local_810.ray = (RTCRayN *)ray;
                  if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar228 = ZEXT1664(auVar78);
                    auVar231 = ZEXT464((uint)fVar233);
                    auVar235 = ZEXT1664(local_720._0_16_);
                    auVar240 = ZEXT1664(local_740._0_16_);
                    auVar245 = ZEXT1664(auVar76);
                    (*pGVar5->intersectionFilterN)(&local_810);
                    auVar250 = ZEXT3264(local_840);
                  }
                  uVar69 = vptestmd_avx512vl(local_860,local_860);
                  if ((uVar69 & 0xf) != 0) {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar228 = ZEXT1664(auVar228._0_16_);
                      auVar231 = ZEXT1664(auVar231._0_16_);
                      auVar235 = ZEXT1664(auVar235._0_16_);
                      auVar240 = ZEXT1664(auVar240._0_16_);
                      auVar245 = ZEXT1664(auVar245._0_16_);
                      (*p_Var6)(&local_810);
                      auVar250 = ZEXT3264(local_840);
                    }
                    uVar69 = vptestmd_avx512vl(local_860,local_860);
                    uVar69 = uVar69 & 0xf;
                    bVar67 = (byte)uVar69;
                    if (bVar67 != 0) {
                      iVar57 = *(int *)(local_810.hit + 4);
                      iVar58 = *(int *)(local_810.hit + 8);
                      iVar59 = *(int *)(local_810.hit + 0xc);
                      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar69 >> 2) & 1);
                      bVar8 = SUB81(uVar69 >> 3,0);
                      *(uint *)(local_810.ray + 0xc0) =
                           (uint)(bVar67 & 1) * *(int *)local_810.hit |
                           (uint)!(bool)(bVar67 & 1) * *(int *)(local_810.ray + 0xc0);
                      *(uint *)(local_810.ray + 0xc4) =
                           (uint)bVar70 * iVar57 | (uint)!bVar70 * *(int *)(local_810.ray + 0xc4);
                      *(uint *)(local_810.ray + 200) =
                           (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_810.ray + 200);
                      *(uint *)(local_810.ray + 0xcc) =
                           (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_810.ray + 0xcc);
                      iVar57 = *(int *)(local_810.hit + 0x14);
                      iVar58 = *(int *)(local_810.hit + 0x18);
                      iVar59 = *(int *)(local_810.hit + 0x1c);
                      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar69 >> 2) & 1);
                      bVar8 = SUB81(uVar69 >> 3,0);
                      *(uint *)(local_810.ray + 0xd0) =
                           (uint)(bVar67 & 1) * *(int *)(local_810.hit + 0x10) |
                           (uint)!(bool)(bVar67 & 1) * *(int *)(local_810.ray + 0xd0);
                      *(uint *)(local_810.ray + 0xd4) =
                           (uint)bVar70 * iVar57 | (uint)!bVar70 * *(int *)(local_810.ray + 0xd4);
                      *(uint *)(local_810.ray + 0xd8) =
                           (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_810.ray + 0xd8);
                      *(uint *)(local_810.ray + 0xdc) =
                           (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_810.ray + 0xdc);
                      iVar57 = *(int *)(local_810.hit + 0x24);
                      iVar58 = *(int *)(local_810.hit + 0x28);
                      iVar59 = *(int *)(local_810.hit + 0x2c);
                      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar69 >> 2) & 1);
                      bVar8 = SUB81(uVar69 >> 3,0);
                      *(uint *)(local_810.ray + 0xe0) =
                           (uint)(bVar67 & 1) * *(int *)(local_810.hit + 0x20) |
                           (uint)!(bool)(bVar67 & 1) * *(int *)(local_810.ray + 0xe0);
                      *(uint *)(local_810.ray + 0xe4) =
                           (uint)bVar70 * iVar57 | (uint)!bVar70 * *(int *)(local_810.ray + 0xe4);
                      *(uint *)(local_810.ray + 0xe8) =
                           (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_810.ray + 0xe8);
                      *(uint *)(local_810.ray + 0xec) =
                           (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_810.ray + 0xec);
                      iVar57 = *(int *)(local_810.hit + 0x34);
                      iVar58 = *(int *)(local_810.hit + 0x38);
                      iVar59 = *(int *)(local_810.hit + 0x3c);
                      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar69 >> 2) & 1);
                      bVar8 = SUB81(uVar69 >> 3,0);
                      *(uint *)(local_810.ray + 0xf0) =
                           (uint)(bVar67 & 1) * *(int *)(local_810.hit + 0x30) |
                           (uint)!(bool)(bVar67 & 1) * *(int *)(local_810.ray + 0xf0);
                      *(uint *)(local_810.ray + 0xf4) =
                           (uint)bVar70 * iVar57 | (uint)!bVar70 * *(int *)(local_810.ray + 0xf4);
                      *(uint *)(local_810.ray + 0xf8) =
                           (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_810.ray + 0xf8);
                      *(uint *)(local_810.ray + 0xfc) =
                           (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_810.ray + 0xfc);
                      iVar57 = *(int *)(local_810.hit + 0x44);
                      iVar58 = *(int *)(local_810.hit + 0x48);
                      iVar59 = *(int *)(local_810.hit + 0x4c);
                      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar69 >> 2) & 1);
                      bVar8 = SUB81(uVar69 >> 3,0);
                      *(uint *)(local_810.ray + 0x100) =
                           (uint)(bVar67 & 1) * *(int *)(local_810.hit + 0x40) |
                           (uint)!(bool)(bVar67 & 1) * *(int *)(local_810.ray + 0x100);
                      *(uint *)(local_810.ray + 0x104) =
                           (uint)bVar70 * iVar57 | (uint)!bVar70 * *(int *)(local_810.ray + 0x104);
                      *(uint *)(local_810.ray + 0x108) =
                           (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_810.ray + 0x108);
                      *(uint *)(local_810.ray + 0x10c) =
                           (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_810.ray + 0x10c);
                      auVar74 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x50));
                      *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar74;
                      auVar74 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x60));
                      *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar74;
                      auVar74 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x70));
                      *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar74;
                      auVar74 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x80));
                      *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar74;
                      goto LAB_01a9a2fc;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar232;
                }
              }
            }
LAB_01a9a2fc:
            uVar162 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar220._4_4_ = uVar162;
            auVar220._0_4_ = uVar162;
            auVar220._8_4_ = uVar162;
            auVar220._12_4_ = uVar162;
            auVar220._16_4_ = uVar162;
            auVar220._20_4_ = uVar162;
            auVar220._24_4_ = uVar162;
            auVar220._28_4_ = uVar162;
            auVar222 = ZEXT3264(auVar220);
            auVar60._4_4_ = fStack_3dc;
            auVar60._0_4_ = local_3e0;
            auVar60._8_4_ = fStack_3d8;
            auVar60._12_4_ = fStack_3d4;
            auVar60._16_4_ = fStack_3d0;
            auVar60._20_4_ = fStack_3cc;
            auVar60._24_4_ = fStack_3c8;
            auVar60._28_4_ = fStack_3c4;
            uVar15 = vcmpps_avx512vl(auVar220,auVar60,0xd);
          }
          auVar152._0_4_ = (float)local_420._0_4_ + (float)local_400._0_4_;
          auVar152._4_4_ = (float)local_420._4_4_ + (float)local_400._4_4_;
          auVar152._8_4_ = fStack_418 + fStack_3f8;
          auVar152._12_4_ = fStack_414 + fStack_3f4;
          auVar152._16_4_ = fStack_410 + fStack_3f0;
          auVar152._20_4_ = fStack_40c + fStack_3ec;
          auVar152._24_4_ = fStack_408 + fStack_3e8;
          auVar152._28_4_ = fStack_404 + fStack_3e4;
          uVar162 = auVar222._0_4_;
          auVar174._4_4_ = uVar162;
          auVar174._0_4_ = uVar162;
          auVar174._8_4_ = uVar162;
          auVar174._12_4_ = uVar162;
          auVar174._16_4_ = uVar162;
          auVar174._20_4_ = uVar162;
          auVar174._24_4_ = uVar162;
          auVar174._28_4_ = uVar162;
          uVar15 = vcmpps_avx512vl(auVar152,auVar174,2);
          auVar153._8_4_ = 2;
          auVar153._0_8_ = 0x200000002;
          auVar153._12_4_ = 2;
          auVar153._16_4_ = 2;
          auVar153._20_4_ = 2;
          auVar153._24_4_ = 2;
          auVar153._28_4_ = 2;
          auVar29._8_4_ = 3;
          auVar29._0_8_ = 0x300000003;
          auVar29._12_4_ = 3;
          auVar29._16_4_ = 3;
          auVar29._20_4_ = 3;
          auVar29._24_4_ = 3;
          auVar29._28_4_ = 3;
          auVar84 = vpblendmd_avx512vl(auVar153,auVar29);
          bVar70 = (bool)((byte)local_850 & 1);
          local_400._0_4_ = (uint)bVar70 * auVar84._0_4_ | (uint)!bVar70 * 2;
          bVar70 = (bool)((byte)(local_850 >> 1) & 1);
          local_400._4_4_ = (uint)bVar70 * auVar84._4_4_ | (uint)!bVar70 * 2;
          bVar70 = (bool)((byte)(local_850 >> 2) & 1);
          fStack_3f8 = (float)((uint)bVar70 * auVar84._8_4_ | (uint)!bVar70 * 2);
          bVar70 = (bool)((byte)(local_850 >> 3) & 1);
          fStack_3f4 = (float)((uint)bVar70 * auVar84._12_4_ | (uint)!bVar70 * 2);
          bVar70 = (bool)((byte)(local_850 >> 4) & 1);
          fStack_3f0 = (float)((uint)bVar70 * auVar84._16_4_ | (uint)!bVar70 * 2);
          bVar70 = (bool)((byte)(local_850 >> 5) & 1);
          fStack_3ec = (float)((uint)bVar70 * auVar84._20_4_ | (uint)!bVar70 * 2);
          bVar70 = (bool)((byte)(local_850 >> 6) & 1);
          fStack_3e8 = (float)((uint)bVar70 * auVar84._24_4_ | (uint)!bVar70 * 2);
          bVar70 = (bool)((byte)(local_850 >> 7) & 1);
          fStack_3e4 = (float)((uint)bVar70 * auVar84._28_4_ | (uint)!bVar70 * 2);
          bVar63 = (byte)uVar17 & bVar63 & (byte)uVar15;
          uVar15 = vpcmpd_avx512vl(_local_400,local_3a0,2);
          local_440 = _local_360;
          local_3e0 = (float)local_420._0_4_ + (float)local_360._0_4_;
          fStack_3dc = (float)local_420._4_4_ + (float)local_360._4_4_;
          fStack_3d8 = fStack_418 + fStack_358;
          fStack_3d4 = fStack_414 + fStack_354;
          fStack_3d0 = fStack_410 + fStack_350;
          fStack_3cc = fStack_40c + fStack_34c;
          fStack_3c8 = fStack_408 + fStack_348;
          fStack_3c4 = fStack_404 + fStack_344;
          for (bVar67 = (byte)uVar15 & bVar63; auVar84 = local_780, bVar67 != 0;
              bVar67 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar67 & (byte)uVar15) {
            auVar154._8_4_ = 0x7f800000;
            auVar154._0_8_ = 0x7f8000007f800000;
            auVar154._12_4_ = 0x7f800000;
            auVar154._16_4_ = 0x7f800000;
            auVar154._20_4_ = 0x7f800000;
            auVar154._24_4_ = 0x7f800000;
            auVar154._28_4_ = 0x7f800000;
            auVar82 = vblendmps_avx512vl(auVar154,local_440);
            auVar131._0_4_ =
                 (uint)(bVar67 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar67 & 1) * 0x7f800000;
            bVar70 = (bool)(bVar67 >> 1 & 1);
            auVar131._4_4_ = (uint)bVar70 * auVar82._4_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar67 >> 2 & 1);
            auVar131._8_4_ = (uint)bVar70 * auVar82._8_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar67 >> 3 & 1);
            auVar131._12_4_ = (uint)bVar70 * auVar82._12_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar67 >> 4 & 1);
            auVar131._16_4_ = (uint)bVar70 * auVar82._16_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar67 >> 5 & 1);
            auVar131._20_4_ = (uint)bVar70 * auVar82._20_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar67 >> 6 & 1);
            auVar131._24_4_ = (uint)bVar70 * auVar82._24_4_ | (uint)!bVar70 * 0x7f800000;
            auVar131._28_4_ =
                 (uint)(bVar67 >> 7) * auVar82._28_4_ | (uint)!(bool)(bVar67 >> 7) * 0x7f800000;
            auVar82 = vshufps_avx(auVar131,auVar131,0xb1);
            auVar82 = vminps_avx(auVar131,auVar82);
            auVar83 = vshufpd_avx(auVar82,auVar82,5);
            auVar82 = vminps_avx(auVar82,auVar83);
            auVar83 = vpermpd_avx2(auVar82,0x4e);
            auVar82 = vminps_avx(auVar82,auVar83);
            uVar15 = vcmpps_avx512vl(auVar131,auVar82,0);
            bVar64 = (byte)uVar15 & bVar67;
            bVar65 = bVar67;
            if (bVar64 != 0) {
              bVar65 = bVar64;
            }
            iVar19 = 0;
            for (uVar71 = (uint)bVar65; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            uVar71 = *(uint *)(local_1c0 + (uint)(iVar19 << 2));
            auVar231 = ZEXT464(*(uint *)(local_340 + (uint)(iVar19 << 2)));
            fVar229 = local_844;
            if ((float)local_700._0_4_ < 0.0) {
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar19 << 2)));
              local_780[1] = 0;
              local_780[0] = bVar67;
              local_780._2_30_ = auVar84._2_30_;
              auVar228 = ZEXT1664(auVar228._0_16_);
              auVar235 = ZEXT1664(auVar235._0_16_);
              auVar240 = ZEXT1664(auVar240._0_16_);
              auVar245 = ZEXT1664(auVar245._0_16_);
              fVar229 = sqrtf((float)local_700._0_4_);
              bVar67 = local_780[0];
              auVar231 = ZEXT1664(local_7a0._0_16_);
              auVar250 = ZEXT3264(local_840);
            }
            auVar222 = ZEXT464(uVar71);
            auVar75 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar74 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar76 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar77 = vminps_avx(auVar75,auVar76);
            auVar75 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar76 = vmaxps_avx(auVar74,auVar75);
            auVar205._8_4_ = 0x7fffffff;
            auVar205._0_8_ = 0x7fffffff7fffffff;
            auVar205._12_4_ = 0x7fffffff;
            auVar74 = vandps_avx(auVar77,auVar205);
            auVar75 = vandps_avx(auVar76,auVar205);
            auVar74 = vmaxps_avx(auVar74,auVar75);
            auVar75 = vmovshdup_avx(auVar74);
            auVar75 = vmaxss_avx(auVar75,auVar74);
            auVar74 = vshufpd_avx(auVar74,auVar74,1);
            auVar74 = vmaxss_avx(auVar74,auVar75);
            fVar232 = auVar74._0_4_ * 1.9073486e-06;
            local_640 = vshufps_avx(auVar76,auVar76,0xff);
            lVar66 = 5;
            do {
              do {
                auVar74 = auVar222._0_16_;
                bVar70 = lVar66 == 0;
                lVar66 = lVar66 + -1;
                if (bVar70) goto LAB_01a9afc3;
                local_7a0._0_16_ = auVar231._0_16_;
                uVar162 = auVar231._0_4_;
                auVar145._4_4_ = uVar162;
                auVar145._0_4_ = uVar162;
                auVar145._8_4_ = uVar162;
                auVar145._12_4_ = uVar162;
                auVar75 = vfmadd132ps_fma(auVar145,ZEXT816(0) << 0x40,local_6f0);
                fVar237 = auVar222._0_4_;
                fVar218 = 1.0 - fVar237;
                fVar209 = fVar218 * fVar218 * fVar218;
                fVar233 = fVar237 * fVar237;
                fVar201 = fVar237 * fVar233;
                auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar209),
                                          ZEXT416((uint)fVar201));
                fVar234 = fVar237 * fVar218;
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * fVar234 * 6.0)),
                                          ZEXT416((uint)(fVar218 * fVar234)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar201),
                                          ZEXT416((uint)fVar209));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar234 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar237 * fVar234)));
                fVar209 = fVar209 * 0.16666667;
                fVar210 = (auVar76._0_4_ + auVar72._0_4_) * 0.16666667;
                fVar211 = (auVar77._0_4_ + auVar1._0_4_) * 0.16666667;
                fVar201 = fVar201 * 0.16666667;
                auVar188._0_4_ = fVar201 * (float)local_6e0._0_4_;
                auVar188._4_4_ = fVar201 * (float)local_6e0._4_4_;
                auVar188._8_4_ = fVar201 * fStack_6d8;
                auVar188._12_4_ = fVar201 * fStack_6d4;
                auVar214._4_4_ = fVar211;
                auVar214._0_4_ = fVar211;
                auVar214._8_4_ = fVar211;
                auVar214._12_4_ = fVar211;
                auVar76 = vfmadd132ps_fma(auVar214,auVar188,local_6a0._0_16_);
                auVar189._4_4_ = fVar210;
                auVar189._0_4_ = fVar210;
                auVar189._8_4_ = fVar210;
                auVar189._12_4_ = fVar210;
                auVar76 = vfmadd132ps_fma(auVar189,auVar76,local_6c0._0_16_);
                auVar168._4_4_ = fVar209;
                auVar168._0_4_ = fVar209;
                auVar168._8_4_ = fVar209;
                auVar168._12_4_ = fVar209;
                auVar76 = vfmadd132ps_fma(auVar168,auVar76,local_680._0_16_);
                local_580._0_16_ = auVar76;
                auVar76 = vsubps_avx(auVar75,auVar76);
                auVar75 = vdpps_avx(auVar76,auVar76,0x7f);
                local_720._0_16_ = auVar76;
                local_740._0_16_ = auVar75;
                local_780._0_16_ = ZEXT416((uint)fVar218);
                if (auVar75._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar233;
                  local_7e0._0_4_ = fVar234;
                  auVar240._0_4_ = sqrtf(auVar75._0_4_);
                  auVar240._4_60_ = extraout_var_01;
                  auVar75 = auVar240._0_16_;
                  fVar234 = (float)local_7e0._0_4_;
                  auVar76 = local_780._0_16_;
                }
                else {
                  auVar75 = vsqrtss_avx(auVar75,auVar75);
                  local_7c0._0_4_ = fVar233;
                  auVar76 = ZEXT416((uint)fVar218);
                }
                local_5a0._4_4_ = auVar76._0_4_;
                local_5a0._0_4_ = local_5a0._4_4_;
                fStack_598 = (float)local_5a0._4_4_;
                fStack_594 = (float)local_5a0._4_4_;
                auVar77 = vfnmsub213ss_fma(auVar74,auVar74,ZEXT416((uint)(fVar234 * 4.0)));
                auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * 4.0)),auVar76,auVar76);
                fVar233 = (float)local_5a0._4_4_ * -(float)local_5a0._4_4_ * 0.5;
                fVar234 = auVar77._0_4_ * 0.5;
                fVar209 = auVar76._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar206._0_4_ = (float)local_7c0._0_4_ * (float)local_6e0._0_4_;
                auVar206._4_4_ = (float)local_7c0._0_4_ * (float)local_6e0._4_4_;
                auVar206._8_4_ = (float)local_7c0._0_4_ * fStack_6d8;
                auVar206._12_4_ = (float)local_7c0._0_4_ * fStack_6d4;
                auVar169._4_4_ = fVar209;
                auVar169._0_4_ = fVar209;
                auVar169._8_4_ = fVar209;
                auVar169._12_4_ = fVar209;
                auVar76 = vfmadd132ps_fma(auVar169,auVar206,local_6a0._0_16_);
                auVar190._4_4_ = fVar234;
                auVar190._0_4_ = fVar234;
                auVar190._8_4_ = fVar234;
                auVar190._12_4_ = fVar234;
                auVar76 = vfmadd132ps_fma(auVar190,auVar76,local_6c0._0_16_);
                auVar243._4_4_ = fVar233;
                auVar243._0_4_ = fVar233;
                auVar243._8_4_ = fVar233;
                auVar243._12_4_ = fVar233;
                _local_7c0 = vfmadd132ps_fma(auVar243,auVar76,local_680._0_16_);
                local_5c0._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
                auVar56._12_4_ = 0;
                auVar56._0_12_ = ZEXT812(0);
                fVar233 = local_5c0._0_4_;
                auVar76 = vrsqrt14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar233));
                fVar234 = auVar76._0_4_;
                local_5e0._0_16_ = vrcp14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar233));
                auVar76 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
                local_600._0_4_ = auVar76._0_4_;
                local_7e0._0_4_ = auVar75._0_4_;
                if (fVar233 < -fVar233) {
                  auVar245._0_4_ = sqrtf(fVar233);
                  auVar245._4_60_ = extraout_var_02;
                  auVar75 = ZEXT416((uint)local_7e0._0_4_);
                  auVar77 = auVar245._0_16_;
                  auVar76 = _local_7c0;
                }
                else {
                  auVar77 = vsqrtss_avx512f(local_5c0._0_16_,local_5c0._0_16_);
                  auVar76 = _local_7c0;
                }
                fVar233 = fVar234 * 1.5 + fVar233 * -0.5 * fVar234 * fVar234 * fVar234;
                auVar249._0_4_ = auVar76._0_4_ * fVar233;
                auVar249._4_4_ = auVar76._4_4_ * fVar233;
                auVar249._8_4_ = auVar76._8_4_ * fVar233;
                auVar249._12_4_ = auVar76._12_4_ * fVar233;
                auVar72 = vdpps_avx(local_720._0_16_,auVar249,0x7f);
                fVar210 = auVar75._0_4_;
                fVar234 = auVar72._0_4_;
                auVar146._0_4_ = fVar234 * fVar234;
                auVar146._4_4_ = auVar72._4_4_ * auVar72._4_4_;
                auVar146._8_4_ = auVar72._8_4_ * auVar72._8_4_;
                auVar146._12_4_ = auVar72._12_4_ * auVar72._12_4_;
                auVar1 = vsubps_avx(local_740._0_16_,auVar146);
                fVar209 = auVar1._0_4_;
                auVar170._4_12_ = ZEXT812(0) << 0x20;
                auVar170._0_4_ = fVar209;
                auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
                auVar73 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                auVar79 = vmulss_avx512f(auVar1,ZEXT416(0xbf000000));
                if (fVar209 < 0.0) {
                  local_630 = fVar233;
                  fStack_62c = fVar233;
                  fStack_628 = fVar233;
                  fStack_624 = fVar233;
                  local_620 = auVar249;
                  local_610 = auVar78;
                  fVar209 = sqrtf(fVar209);
                  auVar79 = ZEXT416(auVar79._0_4_);
                  auVar73 = ZEXT416(auVar73._0_4_);
                  auVar77 = ZEXT416(auVar77._0_4_);
                  auVar75 = ZEXT416((uint)local_7e0._0_4_);
                  auVar76 = _local_7c0;
                  auVar249 = local_620;
                  auVar78 = local_610;
                  fVar233 = local_630;
                  fVar211 = fStack_62c;
                  fVar201 = fStack_628;
                  fVar218 = fStack_624;
                }
                else {
                  auVar1 = vsqrtss_avx(auVar1,auVar1);
                  fVar209 = auVar1._0_4_;
                  fVar211 = fVar233;
                  fVar201 = fVar233;
                  fVar218 = fVar233;
                }
                auVar245 = ZEXT1664(auVar76);
                auVar240 = ZEXT1664(local_740._0_16_);
                auVar235 = ZEXT1664(local_720._0_16_);
                auVar250 = ZEXT3264(local_840);
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,auVar74);
                auVar74 = vfmadd231ss_fma(local_780._0_16_,auVar74,SUB6416(ZEXT464(0xc0000000),0));
                auVar191._0_4_ = fVar237 * (float)local_6e0._0_4_;
                auVar191._4_4_ = fVar237 * (float)local_6e0._4_4_;
                auVar191._8_4_ = fVar237 * fStack_6d8;
                auVar191._12_4_ = fVar237 * fStack_6d4;
                auVar207._0_4_ = auVar74._0_4_;
                auVar207._4_4_ = auVar207._0_4_;
                auVar207._8_4_ = auVar207._0_4_;
                auVar207._12_4_ = auVar207._0_4_;
                auVar74 = vfmadd132ps_fma(auVar207,auVar191,local_6a0._0_16_);
                auVar171._0_4_ = auVar1._0_4_;
                auVar171._4_4_ = auVar171._0_4_;
                auVar171._8_4_ = auVar171._0_4_;
                auVar171._12_4_ = auVar171._0_4_;
                auVar74 = vfmadd132ps_fma(auVar171,auVar74,local_6c0._0_16_);
                auVar74 = vfmadd132ps_fma(_local_5a0,auVar74,local_680._0_16_);
                auVar172._0_4_ = auVar74._0_4_ * (float)local_5c0._0_4_;
                auVar172._4_4_ = auVar74._4_4_ * (float)local_5c0._0_4_;
                auVar172._8_4_ = auVar74._8_4_ * (float)local_5c0._0_4_;
                auVar172._12_4_ = auVar74._12_4_ * (float)local_5c0._0_4_;
                auVar74 = vdpps_avx(auVar76,auVar74,0x7f);
                fVar179 = auVar74._0_4_;
                auVar192._0_4_ = auVar76._0_4_ * fVar179;
                auVar192._4_4_ = auVar76._4_4_ * fVar179;
                auVar192._8_4_ = auVar76._8_4_ * fVar179;
                auVar192._12_4_ = auVar76._12_4_ * fVar179;
                auVar74 = vsubps_avx(auVar172,auVar192);
                fVar179 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar80 = vxorps_avx512vl(auVar76,auVar23);
                auVar215._0_4_ = fVar233 * auVar74._0_4_ * fVar179;
                auVar215._4_4_ = fVar211 * auVar74._4_4_ * fVar179;
                auVar215._8_4_ = fVar201 * auVar74._8_4_ * fVar179;
                auVar215._12_4_ = fVar218 * auVar74._12_4_ * fVar179;
                auVar74 = vdpps_avx(auVar80,auVar249,0x7f);
                auVar1 = vmaxss_avx(ZEXT416((uint)fVar232),
                                    ZEXT416((uint)((float)local_7a0._0_4_ * fVar229 * 1.9073486e-06)
                                           ));
                auVar81 = vdivss_avx512f(ZEXT416((uint)fVar232),auVar77);
                auVar77 = vdpps_avx(local_720._0_16_,auVar215,0x7f);
                auVar75 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar232),auVar1);
                auVar81 = vfmadd213ss_fma(ZEXT416((uint)(fVar210 + 1.0)),auVar81,auVar75);
                auVar75 = vdpps_avx(local_6f0,auVar249,0x7f);
                fVar233 = auVar74._0_4_ + auVar77._0_4_;
                auVar74 = vdpps_avx(local_720._0_16_,auVar80,0x7f);
                auVar79 = vmulss_avx512f(auVar79,auVar78);
                auVar78 = vmulss_avx512f(auVar78,auVar78);
                auVar77 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
                auVar79 = vaddss_avx512f(auVar73,ZEXT416((uint)(auVar79._0_4_ * auVar78._0_4_)));
                auVar78 = vfnmadd231ss_fma(auVar74,auVar72,ZEXT416((uint)fVar233));
                auVar73 = vfnmadd231ss_fma(auVar77,auVar72,auVar75);
                auVar74 = vpermilps_avx(local_580._0_16_,0xff);
                fVar209 = fVar209 - auVar74._0_4_;
                auVar74 = vshufps_avx(auVar76,auVar76,0xff);
                auVar77 = vfmsub213ss_fma(auVar78,auVar79,auVar74);
                fVar210 = auVar73._0_4_ * auVar79._0_4_;
                auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar77._0_4_)),
                                          ZEXT416((uint)fVar233),ZEXT416((uint)fVar210));
                auVar228 = ZEXT1664(auVar78);
                fVar211 = auVar78._0_4_;
                fVar237 = fVar237 - (fVar234 * (fVar210 / fVar211) -
                                    fVar209 * (auVar75._0_4_ / fVar211));
                auVar222 = ZEXT464((uint)fVar237);
                fVar233 = (float)local_7a0._0_4_ -
                          (fVar209 * (fVar233 / fVar211) - fVar234 * (auVar77._0_4_ / fVar211));
                auVar231 = ZEXT464((uint)fVar233);
                auVar24._8_4_ = 0x7fffffff;
                auVar24._0_8_ = 0x7fffffff7fffffff;
                auVar24._12_4_ = 0x7fffffff;
                auVar75 = vandps_avx512vl(auVar72,auVar24);
              } while (auVar81._0_4_ <= auVar75._0_4_);
              auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ + auVar1._0_4_)),local_640,
                                        ZEXT416(0x36000000));
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar77 = vandps_avx512vl(ZEXT416((uint)fVar209),auVar25);
            } while (auVar75._0_4_ <= auVar77._0_4_);
            fVar229 = fVar233 + (float)local_650._0_4_;
            if ((((fVar140 <= fVar229) &&
                 (fVar232 = *(float *)(ray + k * 4 + 0x80), fVar229 <= fVar232)) && (0.0 <= fVar237)
                ) && (fVar237 <= 1.0)) {
              auVar193._4_12_ = SUB1612(ZEXT816(0),0);
              auVar193._0_4_ = local_740._0_4_;
              auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar193);
              fVar234 = auVar75._0_4_;
              pGVar5 = (context->scene->geometries).items[uVar2].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar234 = fVar234 * 1.5 + local_740._0_4_ * -0.5 * fVar234 * fVar234 * fVar234;
                auVar194._0_4_ = local_720._0_4_ * fVar234;
                auVar194._4_4_ = local_720._4_4_ * fVar234;
                auVar194._8_4_ = local_720._8_4_ * fVar234;
                auVar194._12_4_ = local_720._12_4_ * fVar234;
                auVar72 = vfmadd213ps_fma(auVar74,auVar194,auVar76);
                auVar74 = vshufps_avx(auVar194,auVar194,0xc9);
                auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                auVar195._0_4_ = auVar194._0_4_ * auVar75._0_4_;
                auVar195._4_4_ = auVar194._4_4_ * auVar75._4_4_;
                auVar195._8_4_ = auVar194._8_4_ * auVar75._8_4_;
                auVar195._12_4_ = auVar194._12_4_ * auVar75._12_4_;
                auVar77 = vfmsub231ps_fma(auVar195,auVar76,auVar74);
                auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
                auVar75 = vshufps_avx(auVar72,auVar72,0xc9);
                auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                auVar147._0_4_ = auVar72._0_4_ * auVar77._0_4_;
                auVar147._4_4_ = auVar72._4_4_ * auVar77._4_4_;
                auVar147._8_4_ = auVar72._8_4_ * auVar77._8_4_;
                auVar147._12_4_ = auVar72._12_4_ * auVar77._12_4_;
                auVar74 = vfmsub231ps_fma(auVar147,auVar74,auVar75);
                uVar162 = auVar74._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar229;
                  uVar4 = vextractps_avx(auVar74,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                  uVar4 = vextractps_avx(auVar74,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar162;
                  *(float *)(ray + k * 4 + 0xf0) = fVar237;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = uVar3;
                  *(uint *)(ray + k * 4 + 0x120) = uVar2;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_520 = (RTCHitN  [16])vshufps_avx(auVar74,auVar74,0x55);
                  auStack_510 = vshufps_avx(auVar74,auVar74,0xaa);
                  local_500 = uVar162;
                  uStack_4fc = uVar162;
                  uStack_4f8 = uVar162;
                  uStack_4f4 = uVar162;
                  local_4f0 = fVar237;
                  fStack_4ec = fVar237;
                  fStack_4e8 = fVar237;
                  fStack_4e4 = fVar237;
                  local_4e0 = ZEXT416(0) << 0x20;
                  local_4d0 = local_540._0_8_;
                  uStack_4c8 = local_540._8_8_;
                  local_4c0 = local_530;
                  vpcmpeqd_avx2(ZEXT1632(local_530),ZEXT1632(local_530));
                  uStack_4ac = context->user->instID[0];
                  local_4b0 = uStack_4ac;
                  uStack_4a8 = uStack_4ac;
                  uStack_4a4 = uStack_4ac;
                  uStack_4a0 = context->user->instPrimID[0];
                  uStack_49c = uStack_4a0;
                  uStack_498 = uStack_4a0;
                  uStack_494 = uStack_4a0;
                  *(float *)(ray + k * 4 + 0x80) = fVar229;
                  local_860 = local_550;
                  local_810.valid = (int *)local_860;
                  local_810.geometryUserPtr = pGVar5->userPtr;
                  local_810.context = context->user;
                  local_810.hit = local_520;
                  local_810.N = 4;
                  local_810.ray = (RTCRayN *)ray;
                  if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar228 = ZEXT1664(auVar78);
                    auVar231 = ZEXT464((uint)fVar233);
                    auVar235 = ZEXT1664(local_720._0_16_);
                    auVar240 = ZEXT1664(local_740._0_16_);
                    auVar245 = ZEXT1664(auVar76);
                    (*pGVar5->intersectionFilterN)(&local_810);
                    auVar250 = ZEXT3264(local_840);
                  }
                  uVar69 = vptestmd_avx512vl(local_860,local_860);
                  if ((uVar69 & 0xf) != 0) {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar228 = ZEXT1664(auVar228._0_16_);
                      auVar231 = ZEXT1664(auVar231._0_16_);
                      auVar235 = ZEXT1664(auVar235._0_16_);
                      auVar240 = ZEXT1664(auVar240._0_16_);
                      auVar245 = ZEXT1664(auVar245._0_16_);
                      (*p_Var6)(&local_810);
                      auVar250 = ZEXT3264(local_840);
                    }
                    uVar69 = vptestmd_avx512vl(local_860,local_860);
                    uVar69 = uVar69 & 0xf;
                    bVar65 = (byte)uVar69;
                    if (bVar65 != 0) {
                      iVar57 = *(int *)(local_810.hit + 4);
                      iVar58 = *(int *)(local_810.hit + 8);
                      iVar59 = *(int *)(local_810.hit + 0xc);
                      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar69 >> 2) & 1);
                      bVar8 = SUB81(uVar69 >> 3,0);
                      *(uint *)(local_810.ray + 0xc0) =
                           (uint)(bVar65 & 1) * *(int *)local_810.hit |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_810.ray + 0xc0);
                      *(uint *)(local_810.ray + 0xc4) =
                           (uint)bVar70 * iVar57 | (uint)!bVar70 * *(int *)(local_810.ray + 0xc4);
                      *(uint *)(local_810.ray + 200) =
                           (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_810.ray + 200);
                      *(uint *)(local_810.ray + 0xcc) =
                           (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_810.ray + 0xcc);
                      iVar57 = *(int *)(local_810.hit + 0x14);
                      iVar58 = *(int *)(local_810.hit + 0x18);
                      iVar59 = *(int *)(local_810.hit + 0x1c);
                      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar69 >> 2) & 1);
                      bVar8 = SUB81(uVar69 >> 3,0);
                      *(uint *)(local_810.ray + 0xd0) =
                           (uint)(bVar65 & 1) * *(int *)(local_810.hit + 0x10) |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_810.ray + 0xd0);
                      *(uint *)(local_810.ray + 0xd4) =
                           (uint)bVar70 * iVar57 | (uint)!bVar70 * *(int *)(local_810.ray + 0xd4);
                      *(uint *)(local_810.ray + 0xd8) =
                           (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_810.ray + 0xd8);
                      *(uint *)(local_810.ray + 0xdc) =
                           (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_810.ray + 0xdc);
                      iVar57 = *(int *)(local_810.hit + 0x24);
                      iVar58 = *(int *)(local_810.hit + 0x28);
                      iVar59 = *(int *)(local_810.hit + 0x2c);
                      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar69 >> 2) & 1);
                      bVar8 = SUB81(uVar69 >> 3,0);
                      *(uint *)(local_810.ray + 0xe0) =
                           (uint)(bVar65 & 1) * *(int *)(local_810.hit + 0x20) |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_810.ray + 0xe0);
                      *(uint *)(local_810.ray + 0xe4) =
                           (uint)bVar70 * iVar57 | (uint)!bVar70 * *(int *)(local_810.ray + 0xe4);
                      *(uint *)(local_810.ray + 0xe8) =
                           (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_810.ray + 0xe8);
                      *(uint *)(local_810.ray + 0xec) =
                           (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_810.ray + 0xec);
                      iVar57 = *(int *)(local_810.hit + 0x34);
                      iVar58 = *(int *)(local_810.hit + 0x38);
                      iVar59 = *(int *)(local_810.hit + 0x3c);
                      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar69 >> 2) & 1);
                      bVar8 = SUB81(uVar69 >> 3,0);
                      *(uint *)(local_810.ray + 0xf0) =
                           (uint)(bVar65 & 1) * *(int *)(local_810.hit + 0x30) |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_810.ray + 0xf0);
                      *(uint *)(local_810.ray + 0xf4) =
                           (uint)bVar70 * iVar57 | (uint)!bVar70 * *(int *)(local_810.ray + 0xf4);
                      *(uint *)(local_810.ray + 0xf8) =
                           (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_810.ray + 0xf8);
                      *(uint *)(local_810.ray + 0xfc) =
                           (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_810.ray + 0xfc);
                      iVar57 = *(int *)(local_810.hit + 0x44);
                      iVar58 = *(int *)(local_810.hit + 0x48);
                      iVar59 = *(int *)(local_810.hit + 0x4c);
                      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar69 >> 2) & 1);
                      bVar8 = SUB81(uVar69 >> 3,0);
                      *(uint *)(local_810.ray + 0x100) =
                           (uint)(bVar65 & 1) * *(int *)(local_810.hit + 0x40) |
                           (uint)!(bool)(bVar65 & 1) * *(int *)(local_810.ray + 0x100);
                      *(uint *)(local_810.ray + 0x104) =
                           (uint)bVar70 * iVar57 | (uint)!bVar70 * *(int *)(local_810.ray + 0x104);
                      *(uint *)(local_810.ray + 0x108) =
                           (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_810.ray + 0x108);
                      *(uint *)(local_810.ray + 0x10c) =
                           (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_810.ray + 0x10c);
                      auVar74 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x50));
                      *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar74;
                      auVar74 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x60));
                      *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar74;
                      auVar74 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x70));
                      *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar74;
                      auVar74 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x80));
                      *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar74;
                      goto LAB_01a9afc3;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar232;
                }
              }
            }
LAB_01a9afc3:
            uVar162 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar221._4_4_ = uVar162;
            auVar221._0_4_ = uVar162;
            auVar221._8_4_ = uVar162;
            auVar221._12_4_ = uVar162;
            auVar221._16_4_ = uVar162;
            auVar221._20_4_ = uVar162;
            auVar221._24_4_ = uVar162;
            auVar221._28_4_ = uVar162;
            auVar222 = ZEXT3264(auVar221);
            auVar61._4_4_ = fStack_3dc;
            auVar61._0_4_ = local_3e0;
            auVar61._8_4_ = fStack_3d8;
            auVar61._12_4_ = fStack_3d4;
            auVar61._16_4_ = fStack_3d0;
            auVar61._20_4_ = fStack_3cc;
            auVar61._24_4_ = fStack_3c8;
            auVar61._28_4_ = fStack_3c4;
            uVar15 = vcmpps_avx512vl(auVar221,auVar61,0xd);
          }
          uVar18 = vpcmpd_avx512vl(local_3a0,local_320,1);
          uVar17 = vpcmpd_avx512vl(local_3a0,_local_400,1);
          auVar175._0_4_ = (float)local_420._0_4_ + (float)local_200._0_4_;
          auVar175._4_4_ = (float)local_420._4_4_ + (float)local_200._4_4_;
          auVar175._8_4_ = fStack_418 + fStack_1f8;
          auVar175._12_4_ = fStack_414 + fStack_1f4;
          auVar175._16_4_ = fStack_410 + fStack_1f0;
          auVar175._20_4_ = fStack_40c + fStack_1ec;
          auVar175._24_4_ = fStack_408 + fStack_1e8;
          auVar175._28_4_ = fStack_404 + fStack_1e4;
          uVar162 = auVar222._0_4_;
          auVar196._4_4_ = uVar162;
          auVar196._0_4_ = uVar162;
          auVar196._8_4_ = uVar162;
          auVar196._12_4_ = uVar162;
          auVar196._16_4_ = uVar162;
          auVar196._20_4_ = uVar162;
          auVar196._24_4_ = uVar162;
          auVar196._28_4_ = uVar162;
          uVar15 = vcmpps_avx512vl(auVar175,auVar196,2);
          bVar67 = (byte)local_84c & (byte)uVar18 & (byte)uVar15;
          auVar208._0_4_ = (float)local_420._0_4_ + (float)local_360._0_4_;
          auVar208._4_4_ = (float)local_420._4_4_ + (float)local_360._4_4_;
          auVar208._8_4_ = fStack_418 + fStack_358;
          auVar208._12_4_ = fStack_414 + fStack_354;
          auVar208._16_4_ = fStack_410 + fStack_350;
          auVar208._20_4_ = fStack_40c + fStack_34c;
          auVar208._24_4_ = fStack_408 + fStack_348;
          auVar208._28_4_ = fStack_404 + fStack_344;
          uVar15 = vcmpps_avx512vl(auVar208,auVar196,2);
          bVar63 = bVar63 & (byte)uVar17 & (byte)uVar15 | bVar67;
          if (bVar63 != 0) {
            abStack_180[uVar68 * 0x60] = bVar63;
            bVar70 = (bool)(bVar67 >> 1 & 1);
            bVar7 = (bool)(bVar67 >> 2 & 1);
            bVar8 = (bool)(bVar67 >> 3 & 1);
            bVar9 = (bool)(bVar67 >> 4 & 1);
            bVar10 = (bool)(bVar67 >> 5 & 1);
            bVar11 = (bool)(bVar67 >> 6 & 1);
            auStack_160[uVar68 * 0x18] =
                 (uint)(bVar67 & 1) * local_200._0_4_ | (uint)!(bool)(bVar67 & 1) * local_360._0_4_;
            auStack_160[uVar68 * 0x18 + 1] =
                 (uint)bVar70 * local_200._4_4_ | (uint)!bVar70 * local_360._4_4_;
            auStack_160[uVar68 * 0x18 + 2] =
                 (uint)bVar7 * (int)fStack_1f8 | (uint)!bVar7 * (int)fStack_358;
            auStack_160[uVar68 * 0x18 + 3] =
                 (uint)bVar8 * (int)fStack_1f4 | (uint)!bVar8 * (int)fStack_354;
            auStack_160[uVar68 * 0x18 + 4] =
                 (uint)bVar9 * (int)fStack_1f0 | (uint)!bVar9 * (int)fStack_350;
            auStack_160[uVar68 * 0x18 + 5] =
                 (uint)bVar10 * (int)fStack_1ec | (uint)!bVar10 * (int)fStack_34c;
            auStack_160[uVar68 * 0x18 + 6] =
                 (uint)bVar11 * (int)fStack_1e8 | (uint)!bVar11 * (int)fStack_348;
            auStack_160[uVar68 * 0x18 + 7] =
                 (uint)(bVar67 >> 7) * (int)fStack_1e4 |
                 (uint)!(bool)(bVar67 >> 7) * (int)fStack_344;
            uVar69 = vmovlps_avx(local_3b0);
            (&uStack_140)[uVar68 * 0xc] = uVar69;
            aiStack_138[uVar68 * 0x18] = local_a44 + 1;
            uVar68 = (ulong)((int)uVar68 + 1);
          }
          auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar251 = ZEXT3264(auVar84);
          auVar222 = ZEXT3264(_DAT_01f7b040);
          prim = local_750;
        }
      }
    }
    do {
      uVar71 = (uint)uVar68;
      uVar68 = (ulong)(uVar71 - 1);
      if (uVar71 == 0) {
        uVar162 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar31._4_4_ = uVar162;
        auVar31._0_4_ = uVar162;
        auVar31._8_4_ = uVar162;
        auVar31._12_4_ = uVar162;
        auVar31._16_4_ = uVar162;
        auVar31._20_4_ = uVar162;
        auVar31._24_4_ = uVar162;
        auVar31._28_4_ = uVar162;
        uVar15 = vcmpps_avx512vl(local_300,auVar31,2);
        local_748 = (ulong)((uint)local_748 & (uint)uVar15);
        goto LAB_01a989f8;
      }
      auVar84 = *(undefined1 (*) [32])(auStack_160 + uVar68 * 0x18);
      auVar176._0_4_ = auVar84._0_4_ + (float)local_420._0_4_;
      auVar176._4_4_ = auVar84._4_4_ + (float)local_420._4_4_;
      auVar176._8_4_ = auVar84._8_4_ + fStack_418;
      auVar176._12_4_ = auVar84._12_4_ + fStack_414;
      auVar176._16_4_ = auVar84._16_4_ + fStack_410;
      auVar176._20_4_ = auVar84._20_4_ + fStack_40c;
      auVar176._24_4_ = auVar84._24_4_ + fStack_408;
      auVar176._28_4_ = auVar84._28_4_ + fStack_404;
      uVar162 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar30._4_4_ = uVar162;
      auVar30._0_4_ = uVar162;
      auVar30._8_4_ = uVar162;
      auVar30._12_4_ = uVar162;
      auVar30._16_4_ = uVar162;
      auVar30._20_4_ = uVar162;
      auVar30._24_4_ = uVar162;
      auVar30._28_4_ = uVar162;
      uVar15 = vcmpps_avx512vl(auVar176,auVar30,2);
      uVar133 = (uint)uVar15 & (uint)abStack_180[uVar68 * 0x60];
    } while (uVar133 == 0);
    uVar69 = (&uStack_140)[uVar68 * 0xc];
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar69;
    auVar197._8_4_ = 0x7f800000;
    auVar197._0_8_ = 0x7f8000007f800000;
    auVar197._12_4_ = 0x7f800000;
    auVar197._16_4_ = 0x7f800000;
    auVar197._20_4_ = 0x7f800000;
    auVar197._24_4_ = 0x7f800000;
    auVar197._28_4_ = 0x7f800000;
    auVar82 = vblendmps_avx512vl(auVar197,auVar84);
    bVar63 = (byte)uVar133;
    auVar132._0_4_ =
         (uint)(bVar63 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar63 & 1) * (int)auVar84._0_4_;
    bVar70 = (bool)((byte)(uVar133 >> 1) & 1);
    auVar132._4_4_ = (uint)bVar70 * auVar82._4_4_ | (uint)!bVar70 * (int)auVar84._4_4_;
    bVar70 = (bool)((byte)(uVar133 >> 2) & 1);
    auVar132._8_4_ = (uint)bVar70 * auVar82._8_4_ | (uint)!bVar70 * (int)auVar84._8_4_;
    bVar70 = (bool)((byte)(uVar133 >> 3) & 1);
    auVar132._12_4_ = (uint)bVar70 * auVar82._12_4_ | (uint)!bVar70 * (int)auVar84._12_4_;
    bVar70 = (bool)((byte)(uVar133 >> 4) & 1);
    auVar132._16_4_ = (uint)bVar70 * auVar82._16_4_ | (uint)!bVar70 * (int)auVar84._16_4_;
    bVar70 = (bool)((byte)(uVar133 >> 5) & 1);
    auVar132._20_4_ = (uint)bVar70 * auVar82._20_4_ | (uint)!bVar70 * (int)auVar84._20_4_;
    bVar70 = (bool)((byte)(uVar133 >> 6) & 1);
    auVar132._24_4_ = (uint)bVar70 * auVar82._24_4_ | (uint)!bVar70 * (int)auVar84._24_4_;
    auVar132._28_4_ =
         (uVar133 >> 7) * auVar82._28_4_ | (uint)!SUB41(uVar133 >> 7,0) * (int)auVar84._28_4_;
    auVar84 = vshufps_avx(auVar132,auVar132,0xb1);
    auVar84 = vminps_avx(auVar132,auVar84);
    auVar82 = vshufpd_avx(auVar84,auVar84,5);
    auVar84 = vminps_avx(auVar84,auVar82);
    auVar82 = vpermpd_avx2(auVar84,0x4e);
    auVar84 = vminps_avx(auVar84,auVar82);
    uVar15 = vcmpps_avx512vl(auVar132,auVar84,0);
    bVar67 = (byte)uVar15 & bVar63;
    if (bVar67 != 0) {
      uVar133 = (uint)bVar67;
    }
    uVar134 = 0;
    for (; (uVar133 & 1) == 0; uVar133 = uVar133 >> 1 | 0x80000000) {
      uVar134 = uVar134 + 1;
    }
    local_a44 = aiStack_138[uVar68 * 0x18];
    bVar63 = ~('\x01' << ((byte)uVar134 & 0x1f)) & bVar63;
    abStack_180[uVar68 * 0x60] = bVar63;
    if (bVar63 == 0) {
      uVar71 = uVar71 - 1;
    }
    uVar162 = (undefined4)uVar69;
    auVar155._4_4_ = uVar162;
    auVar155._0_4_ = uVar162;
    auVar155._8_4_ = uVar162;
    auVar155._12_4_ = uVar162;
    auVar155._16_4_ = uVar162;
    auVar155._20_4_ = uVar162;
    auVar155._24_4_ = uVar162;
    auVar155._28_4_ = uVar162;
    auVar74 = vmovshdup_avx(auVar173);
    auVar74 = vsubps_avx(auVar74,auVar173);
    auVar177._0_4_ = auVar74._0_4_;
    auVar177._4_4_ = auVar177._0_4_;
    auVar177._8_4_ = auVar177._0_4_;
    auVar177._12_4_ = auVar177._0_4_;
    auVar177._16_4_ = auVar177._0_4_;
    auVar177._20_4_ = auVar177._0_4_;
    auVar177._24_4_ = auVar177._0_4_;
    auVar177._28_4_ = auVar177._0_4_;
    auVar74 = vfmadd132ps_fma(auVar177,auVar155,auVar222._0_32_);
    _local_520 = ZEXT1632(auVar74);
    local_3b0._8_8_ = 0;
    local_3b0._0_8_ = *(ulong *)(local_520 + (ulong)uVar134 * 4);
    uVar68 = (ulong)uVar71;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }